

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  ulong uVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  byte bVar77;
  byte bVar78;
  uint uVar79;
  long lVar80;
  undefined1 (*pauVar81) [32];
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  int iVar85;
  uint uVar86;
  ulong uVar87;
  bool bVar88;
  bool bVar89;
  float fVar119;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar120;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar93 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar124;
  float fVar142;
  float fVar145;
  vint4 bi_1;
  undefined1 auVar127 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar148;
  undefined1 auVar128 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar143;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar156;
  float fVar179;
  float fVar180;
  vint4 ai;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar181;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar163 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar182;
  float fVar202;
  float fVar203;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [28];
  float fVar204;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar205;
  float fVar219;
  float fVar220;
  vint4 bi;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar221;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar226;
  float fVar239;
  float fVar240;
  vint4 ai_2;
  undefined1 auVar227 [16];
  float fVar241;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar242;
  float fVar248;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar245;
  float fVar247;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar243;
  float fVar244;
  float fVar246;
  undefined1 auVar238 [64];
  float fVar249;
  float fVar250;
  float fVar262;
  float fVar266;
  undefined1 auVar251 [16];
  float fVar270;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar263;
  float fVar264;
  float fVar267;
  float fVar268;
  float fVar271;
  float fVar272;
  float fVar275;
  float fVar278;
  float fVar281;
  undefined1 auVar255 [32];
  float fVar265;
  float fVar269;
  float fVar273;
  float fVar276;
  float fVar279;
  float fVar282;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar274;
  float fVar277;
  float fVar280;
  undefined1 auVar261 [64];
  float fVar283;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar294;
  undefined1 auVar287 [32];
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar296;
  float fVar298;
  float fVar300;
  undefined1 auVar290 [64];
  float fVar302;
  float fVar309;
  float fVar310;
  vint4 ai_1;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [64];
  float fVar316;
  float fVar323;
  float fVar325;
  undefined1 auVar318 [16];
  float fVar317;
  undefined1 auVar319 [16];
  undefined1 auVar320 [28];
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar321 [32];
  float fVar329;
  float fVar331;
  undefined1 auVar322 [64];
  float fVar344;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [64];
  float fVar345;
  float fVar354;
  undefined1 auVar346 [32];
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar347 [64];
  float fVar355;
  float fVar360;
  float fVar361;
  undefined1 auVar356 [16];
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar366;
  float fVar371;
  float fVar372;
  undefined1 auVar367 [16];
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar377 [32];
  float fVar378;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b34;
  float local_b20;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8d0;
  undefined4 local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  Primitive *local_7f8;
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar359 [64];
  
  PVar6 = prim[1];
  uVar87 = (ulong)(byte)PVar6;
  lVar80 = uVar87 * 0x19;
  fVar226 = *(float *)(prim + lVar80 + 0x12);
  auVar188 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar80 + 6));
  auVar284._0_4_ = fVar226 * (ray->dir).field_0.m128[0];
  auVar284._4_4_ = fVar226 * (ray->dir).field_0.m128[1];
  auVar284._8_4_ = fVar226 * (ray->dir).field_0.m128[2];
  auVar284._12_4_ = fVar226 * (ray->dir).field_0.m128[3];
  auVar157._0_4_ = fVar226 * auVar188._0_4_;
  auVar157._4_4_ = fVar226 * auVar188._4_4_;
  auVar157._8_4_ = fVar226 * auVar188._8_4_;
  auVar157._12_4_ = fVar226 * auVar188._12_4_;
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar319 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar87 + 6)));
  auVar319 = vcvtdq2ps_avx(auVar319);
  uVar82 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar87 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar82 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar343 = ZEXT1664(auVar133);
  auVar90 = vshufps_avx(auVar284,auVar284,0);
  auVar127 = vshufps_avx(auVar284,auVar284,0x55);
  auVar158 = vshufps_avx(auVar284,auVar284,0xaa);
  fVar226 = auVar158._0_4_;
  fVar182 = auVar158._4_4_;
  fVar239 = auVar158._8_4_;
  fVar202 = auVar158._12_4_;
  fVar249 = auVar127._0_4_;
  fVar262 = auVar127._4_4_;
  fVar266 = auVar127._8_4_;
  fVar270 = auVar127._12_4_;
  fVar240 = auVar90._0_4_;
  fVar203 = auVar90._4_4_;
  fVar241 = auVar90._8_4_;
  fVar204 = auVar90._12_4_;
  auVar356._0_4_ = fVar240 * auVar188._0_4_ + fVar249 * auVar194._0_4_ + fVar226 * auVar99._0_4_;
  auVar356._4_4_ = fVar203 * auVar188._4_4_ + fVar262 * auVar194._4_4_ + fVar182 * auVar99._4_4_;
  auVar356._8_4_ = fVar241 * auVar188._8_4_ + fVar266 * auVar194._8_4_ + fVar239 * auVar99._8_4_;
  auVar356._12_4_ = fVar204 * auVar188._12_4_ + fVar270 * auVar194._12_4_ + fVar202 * auVar99._12_4_
  ;
  auVar359 = ZEXT1664(auVar356);
  auVar367._0_4_ = fVar240 * auVar164._0_4_ + fVar249 * auVar101._0_4_ + auVar319._0_4_ * fVar226;
  auVar367._4_4_ = fVar203 * auVar164._4_4_ + fVar262 * auVar101._4_4_ + auVar319._4_4_ * fVar182;
  auVar367._8_4_ = fVar241 * auVar164._8_4_ + fVar266 * auVar101._8_4_ + auVar319._8_4_ * fVar239;
  auVar367._12_4_ =
       fVar204 * auVar164._12_4_ + fVar270 * auVar101._12_4_ + auVar319._12_4_ * fVar202;
  auVar285._0_4_ = fVar240 * auVar91._0_4_ + fVar249 * auVar100._0_4_ + auVar133._0_4_ * fVar226;
  auVar285._4_4_ = fVar203 * auVar91._4_4_ + fVar262 * auVar100._4_4_ + auVar133._4_4_ * fVar182;
  auVar285._8_4_ = fVar241 * auVar91._8_4_ + fVar266 * auVar100._8_4_ + auVar133._8_4_ * fVar239;
  auVar285._12_4_ = fVar204 * auVar91._12_4_ + fVar270 * auVar100._12_4_ + auVar133._12_4_ * fVar202
  ;
  auVar90 = vshufps_avx(auVar157,auVar157,0);
  auVar347 = ZEXT1664(auVar90);
  auVar127 = vshufps_avx(auVar157,auVar157,0x55);
  auVar158 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar226 = auVar158._0_4_;
  fVar182 = auVar158._4_4_;
  fVar239 = auVar158._8_4_;
  fVar202 = auVar158._12_4_;
  fVar249 = auVar127._0_4_;
  fVar262 = auVar127._4_4_;
  fVar266 = auVar127._8_4_;
  fVar270 = auVar127._12_4_;
  fVar240 = auVar90._0_4_;
  fVar203 = auVar90._4_4_;
  fVar241 = auVar90._8_4_;
  fVar204 = auVar90._12_4_;
  auVar206._0_4_ = fVar240 * auVar188._0_4_ + fVar249 * auVar194._0_4_ + fVar226 * auVar99._0_4_;
  auVar206._4_4_ = fVar203 * auVar188._4_4_ + fVar262 * auVar194._4_4_ + fVar182 * auVar99._4_4_;
  auVar206._8_4_ = fVar241 * auVar188._8_4_ + fVar266 * auVar194._8_4_ + fVar239 * auVar99._8_4_;
  auVar206._12_4_ = fVar204 * auVar188._12_4_ + fVar270 * auVar194._12_4_ + fVar202 * auVar99._12_4_
  ;
  auVar127._0_4_ = fVar240 * auVar164._0_4_ + auVar319._0_4_ * fVar226 + fVar249 * auVar101._0_4_;
  auVar127._4_4_ = fVar203 * auVar164._4_4_ + auVar319._4_4_ * fVar182 + fVar262 * auVar101._4_4_;
  auVar127._8_4_ = fVar241 * auVar164._8_4_ + auVar319._8_4_ * fVar239 + fVar266 * auVar101._8_4_;
  auVar127._12_4_ =
       fVar204 * auVar164._12_4_ + auVar319._12_4_ * fVar202 + fVar270 * auVar101._12_4_;
  auVar90._0_4_ = fVar240 * auVar91._0_4_ + fVar249 * auVar100._0_4_ + auVar133._0_4_ * fVar226;
  auVar90._4_4_ = fVar203 * auVar91._4_4_ + fVar262 * auVar100._4_4_ + auVar133._4_4_ * fVar182;
  auVar90._8_4_ = fVar241 * auVar91._8_4_ + fVar266 * auVar100._8_4_ + auVar133._8_4_ * fVar239;
  auVar90._12_4_ = fVar204 * auVar91._12_4_ + fVar270 * auVar100._12_4_ + auVar133._12_4_ * fVar202;
  auVar251._8_4_ = 0x7fffffff;
  auVar251._0_8_ = 0x7fffffff7fffffff;
  auVar251._12_4_ = 0x7fffffff;
  auVar188 = vandps_avx(auVar356,auVar251);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar188 = vcmpps_avx(auVar188,auVar183,1);
  auVar194 = vblendvps_avx(auVar356,auVar183,auVar188);
  auVar188 = vandps_avx(auVar367,auVar251);
  auVar188 = vcmpps_avx(auVar188,auVar183,1);
  auVar99 = vblendvps_avx(auVar367,auVar183,auVar188);
  auVar188 = vandps_avx(auVar285,auVar251);
  auVar188 = vcmpps_avx(auVar188,auVar183,1);
  auVar188 = vblendvps_avx(auVar285,auVar183,auVar188);
  auVar164 = vrcpps_avx(auVar194);
  fVar249 = auVar164._0_4_;
  auVar158._0_4_ = fVar249 * auVar194._0_4_;
  fVar262 = auVar164._4_4_;
  auVar158._4_4_ = fVar262 * auVar194._4_4_;
  fVar266 = auVar164._8_4_;
  auVar158._8_4_ = fVar266 * auVar194._8_4_;
  fVar270 = auVar164._12_4_;
  auVar158._12_4_ = fVar270 * auVar194._12_4_;
  auVar286._8_4_ = 0x3f800000;
  auVar286._0_8_ = 0x3f8000003f800000;
  auVar286._12_4_ = 0x3f800000;
  auVar194 = vsubps_avx(auVar286,auVar158);
  fVar249 = fVar249 + fVar249 * auVar194._0_4_;
  fVar262 = fVar262 + fVar262 * auVar194._4_4_;
  fVar266 = fVar266 + fVar266 * auVar194._8_4_;
  fVar270 = fVar270 + fVar270 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar99);
  fVar226 = auVar194._0_4_;
  auVar227._0_4_ = fVar226 * auVar99._0_4_;
  fVar239 = auVar194._4_4_;
  auVar227._4_4_ = fVar239 * auVar99._4_4_;
  fVar240 = auVar194._8_4_;
  auVar227._8_4_ = fVar240 * auVar99._8_4_;
  fVar241 = auVar194._12_4_;
  auVar227._12_4_ = fVar241 * auVar99._12_4_;
  auVar194 = vsubps_avx(auVar286,auVar227);
  fVar226 = fVar226 + fVar226 * auVar194._0_4_;
  fVar239 = fVar239 + fVar239 * auVar194._4_4_;
  fVar240 = fVar240 + fVar240 * auVar194._8_4_;
  fVar241 = fVar241 + fVar241 * auVar194._12_4_;
  auVar194 = vrcpps_avx(auVar188);
  fVar182 = auVar194._0_4_;
  auVar184._0_4_ = fVar182 * auVar188._0_4_;
  fVar202 = auVar194._4_4_;
  auVar184._4_4_ = fVar202 * auVar188._4_4_;
  fVar203 = auVar194._8_4_;
  auVar184._8_4_ = fVar203 * auVar188._8_4_;
  fVar204 = auVar194._12_4_;
  auVar184._12_4_ = fVar204 * auVar188._12_4_;
  auVar188 = vsubps_avx(auVar286,auVar184);
  fVar182 = fVar182 + fVar182 * auVar188._0_4_;
  fVar202 = fVar202 + fVar202 * auVar188._4_4_;
  fVar203 = fVar203 + fVar203 * auVar188._8_4_;
  fVar204 = fVar204 + fVar204 * auVar188._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar206);
  auVar159._0_4_ = fVar249 * auVar188._0_4_;
  auVar159._4_4_ = fVar262 * auVar188._4_4_;
  auVar159._8_4_ = fVar266 * auVar188._8_4_;
  auVar159._12_4_ = fVar270 * auVar188._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar188 = vpmovsxwd_avx(auVar194);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar206);
  auVar207._0_4_ = fVar249 * auVar188._0_4_;
  auVar207._4_4_ = fVar262 * auVar188._4_4_;
  auVar207._8_4_ = fVar266 * auVar188._8_4_;
  auVar207._12_4_ = fVar270 * auVar188._12_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar194 = vpmovsxwd_avx(auVar99);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar87 * -2 + 6);
  auVar188 = vpmovsxwd_avx(auVar164);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar127);
  auVar303._0_4_ = auVar188._0_4_ * fVar226;
  auVar303._4_4_ = auVar188._4_4_ * fVar239;
  auVar303._8_4_ = auVar188._8_4_ * fVar240;
  auVar303._12_4_ = auVar188._12_4_ * fVar241;
  auVar188 = vcvtdq2ps_avx(auVar194);
  auVar188 = vsubps_avx(auVar188,auVar127);
  auVar133._0_4_ = fVar226 * auVar188._0_4_;
  auVar133._4_4_ = fVar239 * auVar188._4_4_;
  auVar133._8_4_ = fVar240 * auVar188._8_4_;
  auVar133._12_4_ = fVar241 * auVar188._12_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar82 + uVar87 + 6);
  auVar188 = vpmovsxwd_avx(auVar101);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar90);
  auVar228._0_4_ = auVar188._0_4_ * fVar182;
  auVar228._4_4_ = auVar188._4_4_ * fVar202;
  auVar228._8_4_ = auVar188._8_4_ * fVar203;
  auVar228._12_4_ = auVar188._12_4_ * fVar204;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar188 = vpmovsxwd_avx(auVar319);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar90);
  auVar91._0_4_ = auVar188._0_4_ * fVar182;
  auVar91._4_4_ = auVar188._4_4_ * fVar202;
  auVar91._8_4_ = auVar188._8_4_ * fVar203;
  auVar91._12_4_ = auVar188._12_4_ * fVar204;
  auVar188 = vpminsd_avx(auVar159,auVar207);
  auVar194 = vpminsd_avx(auVar303,auVar133);
  auVar188 = vmaxps_avx(auVar188,auVar194);
  auVar194 = vpminsd_avx(auVar228,auVar91);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar318._4_4_ = uVar1;
  auVar318._0_4_ = uVar1;
  auVar318._8_4_ = uVar1;
  auVar318._12_4_ = uVar1;
  auVar194 = vmaxps_avx(auVar194,auVar318);
  auVar188 = vmaxps_avx(auVar188,auVar194);
  local_520._0_4_ = auVar188._0_4_ * 0.99999964;
  local_520._4_4_ = auVar188._4_4_ * 0.99999964;
  local_520._8_4_ = auVar188._8_4_ * 0.99999964;
  local_520._12_4_ = auVar188._12_4_ * 0.99999964;
  auVar188 = vpmaxsd_avx(auVar159,auVar207);
  auVar194 = vpmaxsd_avx(auVar303,auVar133);
  auVar188 = vminps_avx(auVar188,auVar194);
  auVar194 = vpmaxsd_avx(auVar228,auVar91);
  fVar226 = ray->tfar;
  auVar160._4_4_ = fVar226;
  auVar160._0_4_ = fVar226;
  auVar160._8_4_ = fVar226;
  auVar160._12_4_ = fVar226;
  auVar194 = vminps_avx(auVar194,auVar160);
  auVar188 = vminps_avx(auVar188,auVar194);
  auVar100._0_4_ = auVar188._0_4_ * 1.0000004;
  auVar100._4_4_ = auVar188._4_4_ * 1.0000004;
  auVar100._8_4_ = auVar188._8_4_ * 1.0000004;
  auVar100._12_4_ = auVar188._12_4_ * 1.0000004;
  auVar188 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar194 = vpcmpgtd_avx(auVar188,_DAT_01f7fcf0);
  auVar188 = vcmpps_avx(local_520,auVar100,2);
  auVar188 = vandps_avx(auVar188,auVar194);
  uVar86 = vmovmskps_avx(auVar188);
  if (uVar86 == 0) {
    return false;
  }
  uVar86 = uVar86 & 0xff;
  local_7f8 = prim + lVar80 + 0x16;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  local_7f0 = prim;
LAB_00e169a2:
  local_7e8 = (ulong)uVar86;
  lVar80 = 0;
  if (local_7e8 != 0) {
    for (; (uVar86 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
    }
  }
  local_7e8 = local_7e8 - 1 & local_7e8;
  uVar1 = *(undefined4 *)(local_7f0 + lVar80 * 4 + 6);
  lVar80 = lVar80 * 0x40;
  lVar9 = 0;
  if (local_7e8 != 0) {
    for (; (local_7e8 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar86 = *(uint *)(local_7f0 + 2);
  auVar188 = *(undefined1 (*) [16])(local_7f8 + lVar80);
  if (((local_7e8 != 0) && (uVar87 = local_7e8 - 1 & local_7e8, uVar87 != 0)) &&
     (lVar9 = 0, uVar87 != 0)) {
    for (; (uVar87 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar194 = *(undefined1 (*) [16])(local_7f8 + lVar80 + 0x10);
  auVar99 = *(undefined1 (*) [16])(local_7f8 + lVar80 + 0x20);
  auVar164 = *(undefined1 (*) [16])(local_7f8 + lVar80 + 0x30);
  auVar92._0_4_ = (auVar188._0_4_ + auVar194._0_4_ + auVar99._0_4_ + auVar164._0_4_) * 0.25;
  auVar92._4_4_ = (auVar188._4_4_ + auVar194._4_4_ + auVar99._4_4_ + auVar164._4_4_) * 0.25;
  auVar92._8_4_ = (auVar188._8_4_ + auVar194._8_4_ + auVar99._8_4_ + auVar164._8_4_) * 0.25;
  auVar92._12_4_ = (auVar188._12_4_ + auVar194._12_4_ + auVar99._12_4_ + auVar164._12_4_) * 0.25;
  aVar3 = (ray->org).field_0.field_1;
  aVar4 = (ray->dir).field_0.field_1;
  auVar101 = vsubps_avx(auVar92,(undefined1  [16])aVar3);
  auVar101 = vdpps_avx(auVar101,(undefined1  [16])aVar4,0x7f);
  auVar319 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar91 = vrcpss_avx(auVar319,auVar319);
  auVar322 = ZEXT464(0x40000000);
  fVar226 = auVar101._0_4_ * auVar91._0_4_ * (2.0 - auVar91._0_4_ * auVar319._0_4_);
  local_810 = ZEXT416((uint)fVar226);
  auVar319 = vshufps_avx(local_810,ZEXT416((uint)fVar226),0);
  fVar226 = aVar4.x;
  fVar182 = aVar4.y;
  fVar239 = aVar4.z;
  aVar148 = aVar4.field_3;
  auVar252._0_4_ = aVar3.x + fVar226 * auVar319._0_4_;
  auVar252._4_4_ = aVar3.y + fVar182 * auVar319._4_4_;
  auVar252._8_4_ = aVar3.z + fVar239 * auVar319._8_4_;
  auVar252._12_4_ = aVar3.field_3.w + aVar148.w * auVar319._12_4_;
  auVar101 = vblendps_avx(auVar252,_DAT_01f7aa10,8);
  _local_980 = vsubps_avx(auVar188,auVar101);
  auVar290 = ZEXT1664(_local_980);
  _local_990 = vsubps_avx(auVar99,auVar101);
  _local_9a0 = vsubps_avx(auVar194,auVar101);
  _local_9b0 = vsubps_avx(auVar164,auVar101);
  auVar238 = ZEXT1664(_local_9b0);
  auVar188 = vshufps_avx(_local_980,_local_980,0);
  register0x00001290 = auVar188;
  _local_1e0 = auVar188;
  auVar188 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001290 = auVar188;
  _local_200 = auVar188;
  auVar188 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001290 = auVar188;
  _local_220 = auVar188;
  auVar188 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001290 = auVar188;
  _local_240 = auVar188;
  auVar188 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001290 = auVar188;
  _local_260 = auVar188;
  auVar188 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001290 = auVar188;
  _local_280 = auVar188;
  auVar188 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001290 = auVar188;
  _local_2a0 = auVar188;
  auVar128._0_4_ = fVar226 * fVar226;
  auVar128._4_4_ = fVar182 * fVar182;
  auVar128._8_4_ = fVar239 * fVar239;
  auVar128._12_4_ = aVar148.w * aVar148.w;
  auVar188 = vshufps_avx(auVar128,auVar128,0xaa);
  auVar194 = vshufps_avx(auVar128,auVar128,0x55);
  auVar99 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x000012d0 = auVar99;
  _local_340 = auVar99;
  auVar99 = vshufps_avx(auVar128,auVar128,0);
  local_2c0._0_4_ = auVar99._0_4_ + auVar194._0_4_ + auVar188._0_4_;
  local_2c0._4_4_ = auVar99._4_4_ + auVar194._4_4_ + auVar188._4_4_;
  local_2c0._8_4_ = auVar99._8_4_ + auVar194._8_4_ + auVar188._8_4_;
  local_2c0._12_4_ = auVar99._12_4_ + auVar194._12_4_ + auVar188._12_4_;
  local_2c0._16_4_ = auVar99._0_4_ + auVar194._0_4_ + auVar188._0_4_;
  local_2c0._20_4_ = auVar99._4_4_ + auVar194._4_4_ + auVar188._4_4_;
  local_2c0._24_4_ = auVar99._8_4_ + auVar194._8_4_ + auVar188._8_4_;
  local_2c0._28_4_ = auVar99._12_4_ + auVar194._12_4_ + auVar188._12_4_;
  auVar261 = ZEXT3264(local_2c0);
  auVar188 = vshufps_avx(_local_990,_local_990,0);
  register0x00001250 = auVar188;
  _local_360 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001250 = auVar188;
  _local_380 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001250 = auVar188;
  _local_3a0 = auVar188;
  auVar188 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001250 = auVar188;
  _local_3c0 = auVar188;
  auVar188 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001250 = auVar188;
  _local_3e0 = auVar188;
  auVar188 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001250 = auVar188;
  _local_400 = auVar188;
  auVar188 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001250 = auVar188;
  _local_420 = auVar188;
  auVar188 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x00001250 = auVar188;
  _local_440 = auVar188;
  local_a80._16_16_ = auVar319;
  local_a80._0_16_ = auVar319;
  local_b34 = 1;
  uVar87 = 0;
  bVar88 = false;
  local_560 = (ray->dir).field_0.m128[0];
  local_760 = (ray->dir).field_0.m128[1];
  local_780 = (ray->dir).field_0.m128[2];
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2c0,auVar106);
  local_510 = ZEXT816(0x3f80000000000000);
  fStack_77c = local_780;
  fStack_778 = local_780;
  fStack_774 = local_780;
  fStack_770 = local_780;
  fStack_76c = local_780;
  fStack_768 = local_780;
  fStack_764 = local_780;
  fStack_75c = local_760;
  fStack_758 = local_760;
  fStack_754 = local_760;
  fStack_750 = local_760;
  fStack_74c = local_760;
  fStack_748 = local_760;
  fStack_744 = local_760;
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  do {
    auVar377._8_4_ = 0x3f800000;
    auVar377._0_8_ = 0x3f8000003f800000;
    auVar377._12_4_ = 0x3f800000;
    auVar377._16_4_ = 0x3f800000;
    auVar377._20_4_ = 0x3f800000;
    iVar85 = (int)uVar87;
    auVar377._24_4_ = 0x3f800000;
    auVar377._28_4_ = 0x3f800000;
    auVar188 = vmovshdup_avx(local_510);
    auVar99 = vsubps_avx(auVar188,local_510);
    auVar188 = vshufps_avx(local_510,local_510,0);
    local_740._16_16_ = auVar188;
    local_740._0_16_ = auVar188;
    auVar194 = vshufps_avx(auVar99,auVar99,0);
    fVar124 = auVar194._0_4_;
    fVar142 = auVar194._4_4_;
    fVar145 = auVar194._8_4_;
    fVar149 = auVar194._12_4_;
    fVar156 = auVar188._0_4_;
    auVar198._0_4_ = fVar156 + fVar124 * 0.0;
    fVar179 = auVar188._4_4_;
    auVar198._4_4_ = fVar179 + fVar142 * 0.14285715;
    fVar180 = auVar188._8_4_;
    auVar198._8_4_ = fVar180 + fVar145 * 0.2857143;
    fVar181 = auVar188._12_4_;
    auVar198._12_4_ = fVar181 + fVar149 * 0.42857146;
    auVar198._16_4_ = fVar156 + fVar124 * 0.5714286;
    auVar198._20_4_ = fVar179 + fVar142 * 0.71428573;
    auVar198._24_4_ = fVar180 + fVar145 * 0.8571429;
    auVar198._28_4_ = fVar181 + fVar149;
    auVar105 = vsubps_avx(auVar377,auVar198);
    fVar182 = auVar105._0_4_;
    fVar239 = auVar105._4_4_;
    fVar202 = auVar105._8_4_;
    fVar240 = auVar105._12_4_;
    fVar203 = auVar105._16_4_;
    fVar241 = auVar105._20_4_;
    fVar204 = auVar105._24_4_;
    fVar270 = fVar182 * fVar182 * fVar182;
    fVar263 = fVar239 * fVar239 * fVar239;
    fVar267 = fVar202 * fVar202 * fVar202;
    fVar271 = fVar240 * fVar240 * fVar240;
    fVar274 = fVar203 * fVar203 * fVar203;
    fVar277 = fVar241 * fVar241 * fVar241;
    fVar280 = fVar204 * fVar204 * fVar204;
    fVar283 = auVar198._0_4_ * auVar198._0_4_ * auVar198._0_4_;
    fVar291 = auVar198._4_4_ * auVar198._4_4_ * auVar198._4_4_;
    fVar292 = auVar198._8_4_ * auVar198._8_4_ * auVar198._8_4_;
    fVar294 = auVar198._12_4_ * auVar198._12_4_ * auVar198._12_4_;
    fVar296 = auVar198._16_4_ * auVar198._16_4_ * auVar198._16_4_;
    fVar298 = auVar198._20_4_ * auVar198._20_4_ * auVar198._20_4_;
    fVar300 = auVar198._24_4_ * auVar198._24_4_ * auVar198._24_4_;
    fVar226 = auVar238._28_4_;
    fVar249 = auVar198._0_4_ * fVar182;
    fVar262 = auVar198._4_4_ * fVar239;
    fVar266 = auVar198._8_4_ * fVar202;
    fVar242 = auVar198._12_4_ * fVar240;
    fVar243 = auVar198._16_4_ * fVar203;
    fVar244 = auVar198._20_4_ * fVar241;
    fVar246 = auVar198._24_4_ * fVar204;
    fVar344 = auVar343._28_4_ + auVar359._28_4_;
    fVar315 = auVar290._28_4_ + fVar226 + fVar344;
    fVar335 = fVar344 + auVar261._28_4_ + auVar347._28_4_ + auVar322._28_4_;
    fVar344 = fVar270 * 0.16666667;
    fVar264 = fVar263 * 0.16666667;
    fVar268 = fVar267 * 0.16666667;
    fVar272 = fVar271 * 0.16666667;
    fVar275 = fVar274 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar281 = fVar280 * 0.16666667;
    fVar302 = (fVar283 + fVar270 * 4.0 + fVar182 * fVar249 * 12.0 + auVar198._0_4_ * fVar249 * 6.0)
              * 0.16666667;
    fVar309 = (fVar291 + fVar263 * 4.0 + fVar239 * fVar262 * 12.0 + auVar198._4_4_ * fVar262 * 6.0)
              * 0.16666667;
    fVar310 = (fVar292 + fVar267 * 4.0 + fVar202 * fVar266 * 12.0 + auVar198._8_4_ * fVar266 * 6.0)
              * 0.16666667;
    fVar311 = (fVar294 + fVar271 * 4.0 + fVar240 * fVar242 * 12.0 + auVar198._12_4_ * fVar242 * 6.0)
              * 0.16666667;
    fVar312 = (fVar296 + fVar274 * 4.0 + fVar203 * fVar243 * 12.0 + auVar198._16_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar313 = (fVar298 + fVar277 * 4.0 + fVar241 * fVar244 * 12.0 + auVar198._20_4_ * fVar244 * 6.0)
              * 0.16666667;
    fVar314 = (fVar300 + fVar280 * 4.0 + fVar204 * fVar246 * 12.0 + auVar198._24_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar270 = (fVar283 * 4.0 + fVar270 + auVar198._0_4_ * fVar249 * 12.0 + fVar182 * fVar249 * 6.0)
              * 0.16666667;
    fVar263 = (fVar291 * 4.0 + fVar263 + auVar198._4_4_ * fVar262 * 12.0 + fVar239 * fVar262 * 6.0)
              * 0.16666667;
    fVar267 = (fVar292 * 4.0 + fVar267 + auVar198._8_4_ * fVar266 * 12.0 + fVar202 * fVar266 * 6.0)
              * 0.16666667;
    fVar271 = (fVar294 * 4.0 + fVar271 + auVar198._12_4_ * fVar242 * 12.0 + fVar240 * fVar242 * 6.0)
              * 0.16666667;
    fVar274 = (fVar296 * 4.0 + fVar274 + auVar198._16_4_ * fVar243 * 12.0 + fVar203 * fVar243 * 6.0)
              * 0.16666667;
    fVar277 = (fVar298 * 4.0 + fVar277 + auVar198._20_4_ * fVar244 * 12.0 + fVar241 * fVar244 * 6.0)
              * 0.16666667;
    fVar280 = (fVar300 * 4.0 + fVar280 + auVar198._24_4_ * fVar246 * 12.0 + fVar204 * fVar246 * 6.0)
              * 0.16666667;
    fVar283 = fVar283 * 0.16666667;
    fVar291 = fVar291 * 0.16666667;
    fVar292 = fVar292 * 0.16666667;
    fVar294 = fVar294 * 0.16666667;
    fVar296 = fVar296 * 0.16666667;
    fVar298 = fVar298 * 0.16666667;
    fVar300 = fVar300 * 0.16666667;
    fVar354 = auVar347._28_4_ + 12.0;
    fVar336 = fVar335 + 12.166667;
    local_880 = (float)local_1e0._0_4_ * fVar344 +
                fVar302 * (float)local_260._0_4_ +
                fVar283 * (float)local_3e0._0_4_ + fVar270 * (float)local_360._0_4_;
    fStack_87c = (float)local_1e0._4_4_ * fVar264 +
                 fVar309 * (float)local_260._4_4_ +
                 fVar291 * (float)local_3e0._4_4_ + fVar263 * (float)local_360._4_4_;
    fStack_878 = fStack_1d8 * fVar268 +
                 fVar310 * fStack_258 + fVar292 * fStack_3d8 + fVar267 * fStack_358;
    fStack_874 = fStack_1d4 * fVar272 +
                 fVar311 * fStack_254 + fVar294 * fStack_3d4 + fVar271 * fStack_354;
    fStack_870 = fStack_1d0 * fVar275 +
                 fVar312 * fStack_250 + fVar296 * fStack_3d0 + fVar274 * fStack_350;
    fStack_86c = fStack_1cc * fVar278 +
                 fVar313 * fStack_24c + fVar298 * fStack_3cc + fVar277 * fStack_34c;
    fStack_868 = fStack_1c8 * fVar281 +
                 fVar314 * fStack_248 + fVar300 * fStack_3c8 + fVar280 * fStack_348;
    fStack_864 = fVar315 + fVar336;
    fVar125 = (float)local_200._0_4_ * fVar344 +
              (float)local_280._0_4_ * fVar302 +
              fVar283 * (float)local_400._0_4_ + fVar270 * (float)local_380._0_4_;
    fVar143 = (float)local_200._4_4_ * fVar264 +
              (float)local_280._4_4_ * fVar309 +
              fVar291 * (float)local_400._4_4_ + fVar263 * (float)local_380._4_4_;
    fVar146 = fStack_1f8 * fVar268 +
              fStack_278 * fVar310 + fVar292 * fStack_3f8 + fVar267 * fStack_378;
    fVar150 = fStack_1f4 * fVar272 +
              fStack_274 * fVar311 + fVar294 * fStack_3f4 + fVar271 * fStack_374;
    fVar152 = fStack_1f0 * fVar275 +
              fStack_270 * fVar312 + fVar296 * fStack_3f0 + fVar274 * fStack_370;
    fVar153 = fStack_1ec * fVar278 +
              fStack_26c * fVar313 + fVar298 * fStack_3ec + fVar277 * fStack_36c;
    fVar154 = fStack_1e8 * fVar281 +
              fStack_268 * fVar314 + fVar300 * fStack_3e8 + fVar280 * fStack_368;
    fVar155 = fVar315 + fVar354 + 12.166667;
    fVar126 = (float)local_220._0_4_ * fVar344 +
              (float)local_2a0._0_4_ * fVar302 +
              fVar283 * (float)local_420._0_4_ + fVar270 * (float)local_3a0._0_4_;
    fVar144 = (float)local_220._4_4_ * fVar264 +
              (float)local_2a0._4_4_ * fVar309 +
              fVar291 * (float)local_420._4_4_ + fVar263 * (float)local_3a0._4_4_;
    fVar147 = fStack_218 * fVar268 +
              fStack_298 * fVar310 + fVar292 * fStack_418 + fVar267 * fStack_398;
    fVar151 = fStack_214 * fVar272 +
              fStack_294 * fVar311 + fVar294 * fStack_414 + fVar271 * fStack_394;
    fStack_850 = fStack_210 * fVar275 +
                 fStack_290 * fVar312 + fVar296 * fStack_410 + fVar274 * fStack_390;
    fStack_84c = fStack_20c * fVar278 +
                 fStack_28c * fVar313 + fVar298 * fStack_40c + fVar277 * fStack_38c;
    fStack_848 = fStack_208 * fVar281 +
                 fStack_288 * fVar314 + fVar300 * fStack_408 + fVar280 * fStack_388;
    fStack_844 = fVar315 + fVar354 + auVar359._28_4_ + 12.0;
    local_ac0._0_4_ =
         (float)local_240._0_4_ * fVar344 +
         fVar302 * (float)local_340._0_4_ +
         fVar270 * (float)local_3c0._0_4_ + fVar283 * (float)local_440._0_4_;
    local_ac0._4_4_ =
         (float)local_240._4_4_ * fVar264 +
         fVar309 * (float)local_340._4_4_ +
         fVar263 * (float)local_3c0._4_4_ + fVar291 * (float)local_440._4_4_;
    fStack_ab8 = fStack_238 * fVar268 +
                 fVar310 * fStack_338 + fVar267 * fStack_3b8 + fVar292 * fStack_438;
    fStack_ab4 = fStack_234 * fVar272 +
                 fVar311 * fStack_334 + fVar271 * fStack_3b4 + fVar294 * fStack_434;
    fStack_ab0 = fStack_230 * fVar275 +
                 fVar312 * fStack_330 + fVar274 * fStack_3b0 + fVar296 * fStack_430;
    fStack_aac = fStack_22c * fVar278 +
                 fVar313 * fStack_32c + fVar277 * fStack_3ac + fVar298 * fStack_42c;
    fStack_aa8 = fStack_228 * fVar281 +
                 fVar314 * fStack_328 + fVar280 * fStack_3a8 + fVar300 * fStack_428;
    fStack_aa4 = auVar261._28_4_ + fVar315 + fVar335 + auVar290._28_4_;
    auVar19._4_4_ = auVar198._4_4_ * -auVar198._4_4_;
    auVar19._0_4_ = auVar198._0_4_ * -auVar198._0_4_;
    auVar19._8_4_ = auVar198._8_4_ * -auVar198._8_4_;
    auVar19._12_4_ = auVar198._12_4_ * -auVar198._12_4_;
    auVar19._16_4_ = auVar198._16_4_ * -auVar198._16_4_;
    auVar19._20_4_ = auVar198._20_4_ * -auVar198._20_4_;
    auVar19._24_4_ = auVar198._24_4_ * -auVar198._24_4_;
    auVar19._28_4_ = auVar198._28_4_;
    auVar18._4_4_ = fVar262 * 4.0;
    auVar18._0_4_ = fVar249 * 4.0;
    auVar18._8_4_ = fVar266 * 4.0;
    auVar18._12_4_ = fVar242 * 4.0;
    auVar18._16_4_ = fVar243 * 4.0;
    auVar18._20_4_ = fVar244 * 4.0;
    auVar18._24_4_ = fVar246 * 4.0;
    auVar18._28_4_ = fVar226;
    auVar105 = vsubps_avx(auVar19,auVar18);
    fVar280 = fVar182 * -fVar182 * 0.5;
    fVar281 = fVar239 * -fVar239 * 0.5;
    fVar283 = fVar202 * -fVar202 * 0.5;
    fVar291 = fVar240 * -fVar240 * 0.5;
    fVar292 = fVar203 * -fVar203 * 0.5;
    fVar294 = fVar241 * -fVar241 * 0.5;
    fVar296 = fVar204 * -fVar204 * 0.5;
    fVar263 = auVar105._0_4_ * 0.5;
    fVar264 = auVar105._4_4_ * 0.5;
    fVar271 = auVar105._8_4_ * 0.5;
    fVar274 = auVar105._12_4_ * 0.5;
    fVar275 = auVar105._16_4_ * 0.5;
    fVar277 = auVar105._20_4_ * 0.5;
    fVar278 = auVar105._24_4_ * 0.5;
    fVar270 = (fVar182 * fVar182 + fVar249 * 4.0) * 0.5;
    fVar344 = (fVar239 * fVar239 + fVar262 * 4.0) * 0.5;
    fVar267 = (fVar202 * fVar202 + fVar266 * 4.0) * 0.5;
    fVar268 = (fVar240 * fVar240 + fVar242 * 4.0) * 0.5;
    fVar243 = (fVar203 * fVar203 + fVar243 * 4.0) * 0.5;
    fVar244 = (fVar241 * fVar241 + fVar244 * 4.0) * 0.5;
    fVar246 = (fVar204 * fVar204 + fVar246 * 4.0) * 0.5;
    fVar182 = auVar198._0_4_ * auVar198._0_4_ * 0.5;
    fVar239 = auVar198._4_4_ * auVar198._4_4_ * 0.5;
    fVar202 = auVar198._8_4_ * auVar198._8_4_ * 0.5;
    fVar240 = auVar198._12_4_ * auVar198._12_4_ * 0.5;
    fVar249 = auVar198._16_4_ * auVar198._16_4_ * 0.5;
    fVar262 = auVar198._20_4_ * auVar198._20_4_ * 0.5;
    fVar266 = auVar198._24_4_ * auVar198._24_4_ * 0.5;
    fVar272 = auVar105._28_4_ + fVar181 + fVar226 + fVar336 + fVar226;
    auVar188 = vpermilps_avx(ZEXT416((uint)(auVar99._0_4_ * 0.04761905)),0);
    fVar203 = auVar188._0_4_;
    fVar355 = fVar203 * ((float)local_1e0._0_4_ * fVar280 +
                        (float)local_260._0_4_ * fVar263 +
                        fVar270 * (float)local_360._0_4_ + fVar182 * (float)local_3e0._0_4_);
    fVar241 = auVar188._4_4_;
    fVar360 = fVar241 * ((float)local_1e0._4_4_ * fVar281 +
                        (float)local_260._4_4_ * fVar264 +
                        fVar344 * (float)local_360._4_4_ + fVar239 * (float)local_3e0._4_4_);
    local_a00._4_4_ = fVar360;
    local_a00._0_4_ = fVar355;
    fVar204 = auVar188._8_4_;
    fVar361 = fVar204 * (fStack_1d8 * fVar283 +
                        fStack_258 * fVar271 + fVar267 * fStack_358 + fVar202 * fStack_3d8);
    local_a00._8_4_ = fVar361;
    fVar242 = auVar188._12_4_;
    fVar362 = fVar242 * (fStack_1d4 * fVar291 +
                        fStack_254 * fVar274 + fVar268 * fStack_354 + fVar240 * fStack_3d4);
    local_a00._12_4_ = fVar362;
    fVar363 = fVar203 * (fStack_1d0 * fVar292 +
                        fStack_250 * fVar275 + fVar243 * fStack_350 + fVar249 * fStack_3d0);
    local_a00._16_4_ = fVar363;
    fVar364 = fVar241 * (fStack_1cc * fVar294 +
                        fStack_24c * fVar277 + fVar244 * fStack_34c + fVar262 * fStack_3cc);
    local_a00._20_4_ = fVar364;
    fVar365 = fVar204 * (fStack_1c8 * fVar296 +
                        fStack_248 * fVar278 + fVar246 * fStack_348 + fVar266 * fStack_3c8);
    local_a00._24_4_ = fVar365;
    local_a00._28_4_ = uStack_1c4;
    fVar345 = fVar203 * ((float)local_200._0_4_ * fVar280 +
                        (float)local_280._0_4_ * fVar263 +
                        fVar270 * (float)local_380._0_4_ + fVar182 * (float)local_400._0_4_);
    fVar348 = fVar241 * ((float)local_200._4_4_ * fVar281 +
                        (float)local_280._4_4_ * fVar264 +
                        fVar344 * (float)local_380._4_4_ + fVar239 * (float)local_400._4_4_);
    local_a20._4_4_ = fVar348;
    local_a20._0_4_ = fVar345;
    fVar349 = fVar204 * (fStack_1f8 * fVar283 +
                        fStack_278 * fVar271 + fVar267 * fStack_378 + fVar202 * fStack_3f8);
    local_a20._8_4_ = fVar349;
    fVar350 = fVar242 * (fStack_1f4 * fVar291 +
                        fStack_274 * fVar274 + fVar268 * fStack_374 + fVar240 * fStack_3f4);
    local_a20._12_4_ = fVar350;
    fVar351 = fVar203 * (fStack_1f0 * fVar292 +
                        fStack_270 * fVar275 + fVar243 * fStack_370 + fVar249 * fStack_3f0);
    local_a20._16_4_ = fVar351;
    fVar352 = fVar241 * (fStack_1ec * fVar294 +
                        fStack_26c * fVar277 + fVar244 * fStack_36c + fVar262 * fStack_3ec);
    local_a20._20_4_ = fVar352;
    fVar353 = fVar204 * (fStack_1e8 * fVar296 +
                        fStack_268 * fVar278 + fVar246 * fStack_368 + fVar266 * fStack_3e8);
    local_a20._24_4_ = fVar353;
    local_a20._28_4_ = uStack_224;
    fVar316 = fVar203 * ((float)local_220._0_4_ * fVar280 +
                        fVar182 * (float)local_420._0_4_ + fVar270 * (float)local_3a0._0_4_ +
                        (float)local_2a0._0_4_ * fVar263);
    fVar323 = fVar241 * ((float)local_220._4_4_ * fVar281 +
                        fVar239 * (float)local_420._4_4_ + fVar344 * (float)local_3a0._4_4_ +
                        (float)local_2a0._4_4_ * fVar264);
    local_a40._4_4_ = fVar323;
    local_a40._0_4_ = fVar316;
    fVar325 = fVar204 * (fStack_218 * fVar283 +
                        fVar202 * fStack_418 + fVar267 * fStack_398 + fStack_298 * fVar271);
    local_a40._8_4_ = fVar325;
    fVar327 = fVar242 * (fStack_214 * fVar291 +
                        fVar240 * fStack_414 + fVar268 * fStack_394 + fStack_294 * fVar274);
    local_a40._12_4_ = fVar327;
    fVar329 = fVar203 * (fStack_210 * fVar292 +
                        fVar249 * fStack_410 + fVar243 * fStack_390 + fStack_290 * fVar275);
    local_a40._16_4_ = fVar329;
    fVar331 = fVar241 * (fStack_20c * fVar294 +
                        fVar262 * fStack_40c + fVar244 * fStack_38c + fStack_28c * fVar277);
    local_a40._20_4_ = fVar331;
    fVar333 = fVar204 * (fStack_208 * fVar296 +
                        fVar266 * fStack_408 + fVar246 * fStack_388 + fStack_288 * fVar278);
    local_a40._24_4_ = fVar333;
    local_a40._28_4_ = fVar336;
    fVar263 = fVar203 * ((float)local_240._0_4_ * fVar280 +
                        fVar263 * (float)local_340._0_4_ +
                        fVar182 * (float)local_440._0_4_ + fVar270 * (float)local_3c0._0_4_);
    fVar264 = fVar241 * ((float)local_240._4_4_ * fVar281 +
                        fVar264 * (float)local_340._4_4_ +
                        fVar239 * (float)local_440._4_4_ + fVar344 * (float)local_3c0._4_4_);
    auVar169._4_4_ = fVar264;
    auVar169._0_4_ = fVar263;
    fVar271 = fVar204 * (fStack_238 * fVar283 +
                        fVar271 * fStack_338 + fVar202 * fStack_438 + fVar267 * fStack_3b8);
    auVar169._8_4_ = fVar271;
    fVar242 = fVar242 * (fStack_234 * fVar291 +
                        fVar274 * fStack_334 + fVar240 * fStack_434 + fVar268 * fStack_3b4);
    auVar169._12_4_ = fVar242;
    fVar203 = fVar203 * (fStack_230 * fVar292 +
                        fVar275 * fStack_330 + fVar249 * fStack_430 + fVar243 * fStack_3b0);
    auVar169._16_4_ = fVar203;
    fVar241 = fVar241 * (fStack_22c * fVar294 +
                        fVar277 * fStack_32c + fVar262 * fStack_42c + fVar244 * fStack_3ac);
    auVar169._20_4_ = fVar241;
    fVar204 = fVar204 * (fStack_228 * fVar296 +
                        fVar278 * fStack_328 + fVar266 * fStack_428 + fVar246 * fStack_3a8);
    auVar169._24_4_ = fVar204;
    auVar169._28_4_ = fVar272;
    auVar69._4_4_ = fVar143;
    auVar69._0_4_ = fVar125;
    auVar69._8_4_ = fVar146;
    auVar69._12_4_ = fVar150;
    auVar69._16_4_ = fVar152;
    auVar69._20_4_ = fVar153;
    auVar69._24_4_ = fVar154;
    auVar69._28_4_ = fVar155;
    auVar105 = vperm2f128_avx(auVar69,auVar69,1);
    auVar105 = vshufps_avx(auVar105,auVar69,0x30);
    auVar18 = vshufps_avx(auVar69,auVar105,0x29);
    auVar74._4_4_ = fVar144;
    auVar74._0_4_ = fVar126;
    auVar74._8_4_ = fVar147;
    auVar74._12_4_ = fVar151;
    auVar74._16_4_ = fStack_850;
    auVar74._20_4_ = fStack_84c;
    auVar74._24_4_ = fStack_848;
    auVar74._28_4_ = fStack_844;
    auVar105 = vperm2f128_avx(auVar74,auVar74,1);
    auVar105 = vshufps_avx(auVar105,auVar74,0x30);
    auVar198 = vshufps_avx(auVar74,auVar105,0x29);
    auVar106 = vsubps_avx(_local_ac0,auVar169);
    auVar105 = vperm2f128_avx(auVar106,auVar106,1);
    auVar105 = vshufps_avx(auVar105,auVar106,0x30);
    auVar169 = vshufps_avx(auVar106,auVar105,0x29);
    auVar19 = vsubps_avx(auVar18,auVar69);
    auVar20 = vsubps_avx(auVar198,auVar74);
    fVar182 = auVar19._0_4_;
    fVar262 = auVar19._4_4_;
    auVar22._4_4_ = fVar323 * fVar262;
    auVar22._0_4_ = fVar316 * fVar182;
    fVar268 = auVar19._8_4_;
    auVar22._8_4_ = fVar325 * fVar268;
    fVar277 = auVar19._12_4_;
    auVar22._12_4_ = fVar327 * fVar277;
    fVar296 = auVar19._16_4_;
    auVar22._16_4_ = fVar329 * fVar296;
    fVar313 = auVar19._20_4_;
    auVar22._20_4_ = fVar331 * fVar313;
    fVar11 = auVar19._24_4_;
    auVar22._24_4_ = fVar333 * fVar11;
    auVar22._28_4_ = auVar106._28_4_;
    fVar239 = auVar20._0_4_;
    fVar266 = auVar20._4_4_;
    auVar21._4_4_ = fVar348 * fVar266;
    auVar21._0_4_ = fVar345 * fVar239;
    fVar243 = auVar20._8_4_;
    auVar21._8_4_ = fVar349 * fVar243;
    fVar278 = auVar20._12_4_;
    auVar21._12_4_ = fVar350 * fVar278;
    fVar298 = auVar20._16_4_;
    auVar21._16_4_ = fVar351 * fVar298;
    fVar314 = auVar20._20_4_;
    auVar21._20_4_ = fVar352 * fVar314;
    fVar12 = auVar20._24_4_;
    auVar21._24_4_ = fVar353 * fVar12;
    auVar21._28_4_ = auVar105._28_4_;
    auVar19 = vsubps_avx(auVar21,auVar22);
    auVar71._4_4_ = fStack_87c;
    auVar71._0_4_ = local_880;
    auVar71._8_4_ = fStack_878;
    auVar71._12_4_ = fStack_874;
    auVar71._16_4_ = fStack_870;
    auVar71._20_4_ = fStack_86c;
    auVar71._24_4_ = fStack_868;
    auVar71._28_4_ = fStack_864;
    auVar105 = vperm2f128_avx(auVar71,auVar71,1);
    auVar105 = vshufps_avx(auVar105,auVar71,0x30);
    local_6c0 = vshufps_avx(auVar71,auVar105,0x29);
    auVar21 = vsubps_avx(local_6c0,auVar71);
    auVar23._4_4_ = fVar360 * fVar266;
    auVar23._0_4_ = fVar355 * fVar239;
    auVar23._8_4_ = fVar361 * fVar243;
    auVar23._12_4_ = fVar362 * fVar278;
    auVar23._16_4_ = fVar363 * fVar298;
    auVar23._20_4_ = fVar364 * fVar314;
    auVar23._24_4_ = fVar365 * fVar12;
    auVar23._28_4_ = local_6c0._28_4_;
    fVar202 = auVar21._0_4_;
    fVar270 = auVar21._4_4_;
    auVar24._4_4_ = fVar323 * fVar270;
    auVar24._0_4_ = fVar316 * fVar202;
    fVar244 = auVar21._8_4_;
    auVar24._8_4_ = fVar325 * fVar244;
    fVar280 = auVar21._12_4_;
    auVar24._12_4_ = fVar327 * fVar280;
    fVar300 = auVar21._16_4_;
    auVar24._16_4_ = fVar329 * fVar300;
    fVar315 = auVar21._20_4_;
    auVar24._20_4_ = fVar331 * fVar315;
    fVar13 = auVar21._24_4_;
    auVar24._24_4_ = fVar333 * fVar13;
    auVar24._28_4_ = auVar18._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar23);
    auVar25._4_4_ = fVar348 * fVar270;
    auVar25._0_4_ = fVar345 * fVar202;
    auVar25._8_4_ = fVar349 * fVar244;
    auVar25._12_4_ = fVar350 * fVar280;
    auVar25._16_4_ = fVar351 * fVar300;
    auVar25._20_4_ = fVar352 * fVar315;
    auVar25._24_4_ = fVar353 * fVar13;
    auVar25._28_4_ = auVar18._28_4_;
    auVar218._4_4_ = fVar360 * fVar262;
    auVar218._0_4_ = fVar355 * fVar182;
    auVar218._8_4_ = fVar361 * fVar268;
    auVar218._12_4_ = fVar362 * fVar277;
    auVar218._16_4_ = fVar363 * fVar296;
    auVar218._20_4_ = fVar364 * fVar313;
    auVar218._24_4_ = fVar365 * fVar11;
    auVar218._28_4_ = uStack_204;
    auVar23 = vsubps_avx(auVar218,auVar25);
    fVar226 = auVar23._28_4_;
    auVar134._0_4_ = fVar202 * fVar202 + fVar182 * fVar182 + fVar239 * fVar239;
    auVar134._4_4_ = fVar270 * fVar270 + fVar262 * fVar262 + fVar266 * fVar266;
    auVar134._8_4_ = fVar244 * fVar244 + fVar268 * fVar268 + fVar243 * fVar243;
    auVar134._12_4_ = fVar280 * fVar280 + fVar277 * fVar277 + fVar278 * fVar278;
    auVar134._16_4_ = fVar300 * fVar300 + fVar296 * fVar296 + fVar298 * fVar298;
    auVar134._20_4_ = fVar315 * fVar315 + fVar313 * fVar313 + fVar314 * fVar314;
    auVar134._24_4_ = fVar13 * fVar13 + fVar11 * fVar11 + fVar12 * fVar12;
    auVar134._28_4_ = fVar226 + fVar226 + auVar19._28_4_;
    auVar105 = vrcpps_avx(auVar134);
    fVar274 = auVar105._0_4_;
    fVar275 = auVar105._4_4_;
    auVar26._4_4_ = fVar275 * auVar134._4_4_;
    auVar26._0_4_ = fVar274 * auVar134._0_4_;
    fVar283 = auVar105._8_4_;
    auVar26._8_4_ = fVar283 * auVar134._8_4_;
    fVar291 = auVar105._12_4_;
    auVar26._12_4_ = fVar291 * auVar134._12_4_;
    fVar292 = auVar105._16_4_;
    auVar26._16_4_ = fVar292 * auVar134._16_4_;
    fVar294 = auVar105._20_4_;
    auVar26._20_4_ = fVar294 * auVar134._20_4_;
    fVar309 = auVar105._24_4_;
    auVar26._24_4_ = fVar309 * auVar134._24_4_;
    auVar26._28_4_ = uStack_204;
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = 0x3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar107._16_4_ = 0x3f800000;
    auVar107._20_4_ = 0x3f800000;
    auVar107._24_4_ = 0x3f800000;
    auVar107._28_4_ = 0x3f800000;
    auVar24 = vsubps_avx(auVar107,auVar26);
    fVar274 = auVar24._0_4_ * fVar274 + fVar274;
    fVar275 = auVar24._4_4_ * fVar275 + fVar275;
    fVar283 = auVar24._8_4_ * fVar283 + fVar283;
    fVar291 = auVar24._12_4_ * fVar291 + fVar291;
    fVar292 = auVar24._16_4_ * fVar292 + fVar292;
    fVar294 = auVar24._20_4_ * fVar294 + fVar294;
    fVar309 = auVar24._24_4_ * fVar309 + fVar309;
    auVar106 = vperm2f128_avx(local_a20,local_a20,1);
    auVar106 = vshufps_avx(auVar106,local_a20,0x30);
    local_8a0 = vshufps_avx(local_a20,auVar106,0x29);
    auVar106 = vperm2f128_avx(local_a40,local_a40,1);
    auVar106 = vshufps_avx(auVar106,local_a40,0x30);
    local_700 = vshufps_avx(local_a40,auVar106,0x29);
    fVar240 = local_700._0_4_;
    fVar344 = local_700._4_4_;
    auVar27._4_4_ = fVar262 * fVar344;
    auVar27._0_4_ = fVar182 * fVar240;
    fVar246 = local_700._8_4_;
    auVar27._8_4_ = fVar268 * fVar246;
    fVar281 = local_700._12_4_;
    auVar27._12_4_ = fVar277 * fVar281;
    fVar302 = local_700._16_4_;
    auVar27._16_4_ = fVar296 * fVar302;
    fVar335 = local_700._20_4_;
    auVar27._20_4_ = fVar313 * fVar335;
    fVar14 = local_700._24_4_;
    auVar27._24_4_ = fVar11 * fVar14;
    auVar27._28_4_ = auVar106._28_4_;
    fVar366 = local_8a0._0_4_;
    fVar371 = local_8a0._4_4_;
    auVar288._4_4_ = fVar371 * fVar266;
    auVar288._0_4_ = fVar366 * fVar239;
    fVar372 = local_8a0._8_4_;
    auVar288._8_4_ = fVar372 * fVar243;
    fVar373 = local_8a0._12_4_;
    auVar288._12_4_ = fVar373 * fVar278;
    fVar374 = local_8a0._16_4_;
    auVar288._16_4_ = fVar374 * fVar298;
    fVar375 = local_8a0._20_4_;
    auVar288._20_4_ = fVar375 * fVar314;
    fVar376 = local_8a0._24_4_;
    auVar288._24_4_ = fVar376 * fVar12;
    auVar288._28_4_ = uStack_224;
    auVar25 = vsubps_avx(auVar288,auVar27);
    auVar106 = vperm2f128_avx(local_a00,local_a00,1);
    auVar106 = vshufps_avx(auVar106,local_a00,0x30);
    local_6e0 = vshufps_avx(local_a00,auVar106,0x29);
    fVar317 = local_6e0._0_4_;
    fVar324 = local_6e0._4_4_;
    auVar28._4_4_ = fVar324 * fVar266;
    auVar28._0_4_ = fVar317 * fVar239;
    fVar326 = local_6e0._8_4_;
    auVar28._8_4_ = fVar326 * fVar243;
    fVar328 = local_6e0._12_4_;
    auVar28._12_4_ = fVar328 * fVar278;
    fVar330 = local_6e0._16_4_;
    auVar28._16_4_ = fVar330 * fVar298;
    fVar332 = local_6e0._20_4_;
    auVar28._20_4_ = fVar332 * fVar314;
    fVar334 = local_6e0._24_4_;
    auVar28._24_4_ = fVar334 * fVar12;
    auVar28._28_4_ = auVar106._28_4_;
    auVar29._4_4_ = fVar344 * fVar270;
    auVar29._0_4_ = fVar240 * fVar202;
    auVar29._8_4_ = fVar246 * fVar244;
    auVar29._12_4_ = fVar281 * fVar280;
    auVar29._16_4_ = fVar302 * fVar300;
    auVar29._20_4_ = fVar335 * fVar315;
    auVar29._24_4_ = fVar14 * fVar13;
    auVar29._28_4_ = uStack_1c4;
    auVar218 = vsubps_avx(auVar29,auVar28);
    auVar30._4_4_ = fVar371 * fVar270;
    auVar30._0_4_ = fVar366 * fVar202;
    auVar30._8_4_ = fVar372 * fVar244;
    auVar30._12_4_ = fVar373 * fVar280;
    auVar30._16_4_ = fVar374 * fVar300;
    auVar30._20_4_ = fVar375 * fVar315;
    auVar30._24_4_ = fVar376 * fVar13;
    auVar30._28_4_ = uStack_1c4;
    auVar31._4_4_ = fVar324 * fVar262;
    auVar31._0_4_ = fVar317 * fVar182;
    auVar31._8_4_ = fVar326 * fVar268;
    auVar31._12_4_ = fVar328 * fVar277;
    auVar31._16_4_ = fVar330 * fVar296;
    auVar31._20_4_ = fVar332 * fVar313;
    fVar249 = local_8a0._28_4_;
    auVar31._24_4_ = fVar334 * fVar11;
    auVar31._28_4_ = fVar249;
    auVar106 = vsubps_avx(auVar31,auVar30);
    fVar267 = auVar106._28_4_;
    auVar32._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar23._4_4_ * auVar23._4_4_) * fVar275;
    auVar32._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar23._0_4_ * auVar23._0_4_) * fVar274;
    auVar32._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar23._8_4_ * auVar23._8_4_) * fVar283;
    auVar32._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar23._12_4_ * auVar23._12_4_) * fVar291;
    auVar32._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar23._16_4_ * auVar23._16_4_) * fVar292;
    auVar32._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar23._20_4_ * auVar23._20_4_) * fVar294;
    auVar32._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar23._24_4_ * auVar23._24_4_) * fVar309;
    auVar32._28_4_ = auVar19._28_4_ + auVar22._28_4_ + fVar226;
    auVar33._4_4_ =
         (auVar25._4_4_ * auVar25._4_4_ +
         auVar218._4_4_ * auVar218._4_4_ + auVar106._4_4_ * auVar106._4_4_) * fVar275;
    auVar33._0_4_ =
         (auVar25._0_4_ * auVar25._0_4_ +
         auVar218._0_4_ * auVar218._0_4_ + auVar106._0_4_ * auVar106._0_4_) * fVar274;
    auVar33._8_4_ =
         (auVar25._8_4_ * auVar25._8_4_ +
         auVar218._8_4_ * auVar218._8_4_ + auVar106._8_4_ * auVar106._8_4_) * fVar283;
    auVar33._12_4_ =
         (auVar25._12_4_ * auVar25._12_4_ +
         auVar218._12_4_ * auVar218._12_4_ + auVar106._12_4_ * auVar106._12_4_) * fVar291;
    auVar33._16_4_ =
         (auVar25._16_4_ * auVar25._16_4_ +
         auVar218._16_4_ * auVar218._16_4_ + auVar106._16_4_ * auVar106._16_4_) * fVar292;
    auVar33._20_4_ =
         (auVar25._20_4_ * auVar25._20_4_ +
         auVar218._20_4_ * auVar218._20_4_ + auVar106._20_4_ * auVar106._20_4_) * fVar294;
    auVar33._24_4_ =
         (auVar25._24_4_ * auVar25._24_4_ +
         auVar218._24_4_ * auVar218._24_4_ + auVar106._24_4_ * auVar106._24_4_) * fVar309;
    auVar33._28_4_ = auVar24._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar32,auVar33);
    auVar106 = vperm2f128_avx(_local_ac0,_local_ac0,1);
    auVar106 = vshufps_avx(auVar106,_local_ac0,0x30);
    auVar22 = vshufps_avx(_local_ac0,auVar106,0x29);
    auVar108._0_4_ = (float)local_ac0._0_4_ + fVar263;
    auVar108._4_4_ = (float)local_ac0._4_4_ + fVar264;
    auVar108._8_4_ = fStack_ab8 + fVar271;
    auVar108._12_4_ = fStack_ab4 + fVar242;
    auVar108._16_4_ = fStack_ab0 + fVar203;
    auVar108._20_4_ = fStack_aac + fVar241;
    auVar108._24_4_ = fStack_aa8 + fVar204;
    auVar108._28_4_ = fStack_aa4 + fVar272;
    auVar106 = vmaxps_avx(_local_ac0,auVar108);
    auVar19 = vmaxps_avx(auVar169,auVar22);
    auVar106 = vmaxps_avx(auVar106,auVar19);
    auVar19 = vrsqrtps_avx(auVar134);
    fVar226 = auVar19._0_4_;
    fVar203 = auVar19._4_4_;
    fVar241 = auVar19._8_4_;
    fVar204 = auVar19._12_4_;
    fVar242 = auVar19._16_4_;
    fVar263 = auVar19._20_4_;
    fVar264 = auVar19._24_4_;
    auVar34._4_4_ = fVar203 * fVar203 * fVar203 * auVar134._4_4_ * 0.5;
    auVar34._0_4_ = fVar226 * fVar226 * fVar226 * auVar134._0_4_ * 0.5;
    auVar34._8_4_ = fVar241 * fVar241 * fVar241 * auVar134._8_4_ * 0.5;
    auVar34._12_4_ = fVar204 * fVar204 * fVar204 * auVar134._12_4_ * 0.5;
    auVar34._16_4_ = fVar242 * fVar242 * fVar242 * auVar134._16_4_ * 0.5;
    auVar34._20_4_ = fVar263 * fVar263 * fVar263 * auVar134._20_4_ * 0.5;
    auVar34._24_4_ = fVar264 * fVar264 * fVar264 * auVar134._24_4_ * 0.5;
    auVar34._28_4_ = auVar134._28_4_;
    auVar35._4_4_ = fVar203 * 1.5;
    auVar35._0_4_ = fVar226 * 1.5;
    auVar35._8_4_ = fVar241 * 1.5;
    auVar35._12_4_ = fVar204 * 1.5;
    auVar35._16_4_ = fVar242 * 1.5;
    auVar35._20_4_ = fVar263 * 1.5;
    auVar35._24_4_ = fVar264 * 1.5;
    auVar35._28_4_ = auVar19._28_4_;
    local_300 = vsubps_avx(auVar35,auVar34);
    auVar70._4_4_ = fVar143;
    auVar70._0_4_ = fVar125;
    auVar70._8_4_ = fVar146;
    auVar70._12_4_ = fVar150;
    auVar70._16_4_ = fVar152;
    auVar70._20_4_ = fVar153;
    auVar70._24_4_ = fVar154;
    auVar70._28_4_ = fVar155;
    _local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar70);
    local_720 = vsubps_avx(ZEXT832(0) << 0x20,auVar74);
    fVar203 = local_720._0_4_;
    fVar242 = local_720._4_4_;
    fVar271 = local_720._8_4_;
    fVar283 = local_720._12_4_;
    fVar309 = local_720._16_4_;
    fVar336 = local_720._20_4_;
    fVar15 = local_720._24_4_;
    fVar241 = local_a60._0_4_;
    fVar263 = local_a60._4_4_;
    fVar272 = local_a60._8_4_;
    fVar291 = local_a60._12_4_;
    fVar310 = local_a60._16_4_;
    fVar354 = local_a60._20_4_;
    fVar16 = local_a60._24_4_;
    auVar23 = vsubps_avx(ZEXT832(0) << 0x20,auVar71);
    fVar204 = auVar23._0_4_;
    fVar264 = auVar23._4_4_;
    fVar274 = auVar23._8_4_;
    fVar292 = auVar23._12_4_;
    fVar311 = auVar23._16_4_;
    fVar10 = auVar23._20_4_;
    fVar17 = auVar23._24_4_;
    auVar337._0_4_ = local_560 * fVar204 + local_760 * fVar241 + local_780 * fVar203;
    auVar337._4_4_ = fStack_55c * fVar264 + fStack_75c * fVar263 + fStack_77c * fVar242;
    auVar337._8_4_ = fStack_558 * fVar274 + fStack_758 * fVar272 + fStack_778 * fVar271;
    auVar337._12_4_ = fStack_554 * fVar292 + fStack_754 * fVar291 + fStack_774 * fVar283;
    auVar337._16_4_ = fStack_550 * fVar311 + fStack_750 * fVar310 + fStack_770 * fVar309;
    auVar337._20_4_ = fStack_54c * fVar10 + fStack_74c * fVar354 + fStack_76c * fVar336;
    auVar337._24_4_ = fStack_548 * fVar17 + fStack_748 * fVar16 + fStack_768 * fVar15;
    auVar337._28_4_ = fVar267 + auVar25._28_4_ + auVar218._28_4_ + fVar267 + auVar19._28_4_;
    auVar357._0_4_ = fVar204 * fVar204 + fVar241 * fVar241 + fVar203 * fVar203;
    auVar357._4_4_ = fVar264 * fVar264 + fVar263 * fVar263 + fVar242 * fVar242;
    auVar357._8_4_ = fVar274 * fVar274 + fVar272 * fVar272 + fVar271 * fVar271;
    auVar357._12_4_ = fVar292 * fVar292 + fVar291 * fVar291 + fVar283 * fVar283;
    auVar357._16_4_ = fVar311 * fVar311 + fVar310 * fVar310 + fVar309 * fVar309;
    auVar357._20_4_ = fVar10 * fVar10 + fVar354 * fVar354 + fVar336 * fVar336;
    auVar357._24_4_ = fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15;
    auVar357._28_4_ = fVar249 + fVar249 + fVar267;
    fVar249 = local_300._0_4_;
    fVar267 = local_300._4_4_;
    fVar275 = local_300._8_4_;
    fVar294 = local_300._12_4_;
    fVar312 = local_300._16_4_;
    fVar245 = local_300._20_4_;
    fVar247 = local_300._24_4_;
    auVar306._8_4_ = 0x3f800000;
    auVar306._0_8_ = 0x3f8000003f800000;
    auVar306._12_4_ = 0x3f800000;
    auVar306._16_4_ = 0x3f800000;
    auVar306._20_4_ = 0x3f800000;
    auVar306._24_4_ = 0x3f800000;
    auVar306._28_4_ = 0x3f800000;
    fVar226 = auVar20._28_4_;
    auVar322 = ZEXT3264(local_300);
    fVar378 = local_560 * fVar202 * fVar249 +
              local_760 * fVar182 * fVar249 + fVar239 * fVar249 * local_780;
    fVar383 = fStack_55c * fVar270 * fVar267 +
              fStack_75c * fVar262 * fVar267 + fVar266 * fVar267 * fStack_77c;
    fVar384 = fStack_558 * fVar244 * fVar275 +
              fStack_758 * fVar268 * fVar275 + fVar243 * fVar275 * fStack_778;
    fVar385 = fStack_554 * fVar280 * fVar294 +
              fStack_754 * fVar277 * fVar294 + fVar278 * fVar294 * fStack_774;
    fVar386 = fStack_550 * fVar300 * fVar312 +
              fStack_750 * fVar296 * fVar312 + fVar298 * fVar312 * fStack_770;
    fVar388 = fStack_54c * fVar315 * fVar245 +
              fStack_74c * fVar313 * fVar245 + fVar314 * fVar245 * fStack_76c;
    fVar390 = fStack_548 * fVar13 * fVar247 +
              fStack_748 * fVar11 * fVar247 + fVar12 * fVar247 * fStack_768;
    fVar248 = local_300._28_4_ + fVar226 + 0.0;
    fVar205 = fVar204 * fVar202 * fVar249 +
              fVar182 * fVar249 * fVar241 + fVar239 * fVar249 * fVar203;
    fVar219 = fVar264 * fVar270 * fVar267 +
              fVar262 * fVar267 * fVar263 + fVar266 * fVar267 * fVar242;
    fVar220 = fVar274 * fVar244 * fVar275 +
              fVar268 * fVar275 * fVar272 + fVar243 * fVar275 * fVar271;
    fVar221 = fVar292 * fVar280 * fVar294 +
              fVar277 * fVar294 * fVar291 + fVar278 * fVar294 * fVar283;
    fVar222 = fVar311 * fVar300 * fVar312 +
              fVar296 * fVar312 * fVar310 + fVar298 * fVar312 * fVar309;
    fVar223 = fVar10 * fVar315 * fVar245 + fVar313 * fVar245 * fVar354 + fVar314 * fVar245 * fVar336
    ;
    fVar224 = fVar17 * fVar13 * fVar247 + fVar11 * fVar247 * fVar16 + fVar12 * fVar247 * fVar15;
    fVar225 = fVar226 + fVar248;
    auVar20._4_4_ = fVar383 * fVar219;
    auVar20._0_4_ = fVar378 * fVar205;
    auVar20._8_4_ = fVar384 * fVar220;
    auVar20._12_4_ = fVar385 * fVar221;
    auVar20._16_4_ = fVar386 * fVar222;
    auVar20._20_4_ = fVar388 * fVar223;
    auVar20._24_4_ = fVar390 * fVar224;
    auVar20._28_4_ = fVar248;
    auVar20 = vsubps_avx(auVar337,auVar20);
    auVar36._4_4_ = fVar219 * fVar219;
    auVar36._0_4_ = fVar205 * fVar205;
    auVar36._8_4_ = fVar220 * fVar220;
    auVar36._12_4_ = fVar221 * fVar221;
    auVar36._16_4_ = fVar222 * fVar222;
    auVar36._20_4_ = fVar223 * fVar223;
    auVar36._24_4_ = fVar224 * fVar224;
    auVar36._28_4_ = fVar226;
    auVar24 = vsubps_avx(auVar357,auVar36);
    auVar19 = vsqrtps_avx(auVar105);
    fVar226 = (auVar106._0_4_ + auVar19._0_4_) * 1.0000002;
    fVar248 = (auVar106._4_4_ + auVar19._4_4_) * 1.0000002;
    fVar119 = (auVar106._8_4_ + auVar19._8_4_) * 1.0000002;
    fVar120 = (auVar106._12_4_ + auVar19._12_4_) * 1.0000002;
    fVar121 = (auVar106._16_4_ + auVar19._16_4_) * 1.0000002;
    fVar122 = (auVar106._20_4_ + auVar19._20_4_) * 1.0000002;
    fVar123 = (auVar106._24_4_ + auVar19._24_4_) * 1.0000002;
    auVar37._4_4_ = fVar248 * fVar248;
    auVar37._0_4_ = fVar226 * fVar226;
    auVar37._8_4_ = fVar119 * fVar119;
    auVar37._12_4_ = fVar120 * fVar120;
    auVar37._16_4_ = fVar121 * fVar121;
    auVar37._20_4_ = fVar122 * fVar122;
    auVar37._24_4_ = fVar123 * fVar123;
    auVar37._28_4_ = auVar106._28_4_ + auVar19._28_4_;
    fVar248 = auVar20._0_4_ + auVar20._0_4_;
    fVar119 = auVar20._4_4_ + auVar20._4_4_;
    local_320._0_8_ = CONCAT44(fVar119,fVar248);
    local_320._8_4_ = auVar20._8_4_ + auVar20._8_4_;
    local_320._12_4_ = auVar20._12_4_ + auVar20._12_4_;
    local_320._16_4_ = auVar20._16_4_ + auVar20._16_4_;
    local_320._20_4_ = auVar20._20_4_ + auVar20._20_4_;
    local_320._24_4_ = auVar20._24_4_ + auVar20._24_4_;
    local_320._28_4_ = auVar20._28_4_ + auVar20._28_4_;
    auVar20 = vsubps_avx(auVar24,auVar37);
    auVar359 = ZEXT3264(auVar20);
    auVar38._4_4_ = fVar383 * fVar383;
    auVar38._0_4_ = fVar378 * fVar378;
    auVar38._8_4_ = fVar384 * fVar384;
    auVar38._12_4_ = fVar385 * fVar385;
    auVar38._16_4_ = fVar386 * fVar386;
    auVar38._20_4_ = fVar388 * fVar388;
    auVar38._24_4_ = fVar390 * fVar390;
    auVar38._28_4_ = auVar106._28_4_;
    local_480 = vsubps_avx(local_2c0,auVar38);
    auVar39._4_4_ = fVar119 * fVar119;
    auVar39._0_4_ = fVar248 * fVar248;
    auVar39._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar39._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar39._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar39._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar39._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar39._28_4_ = local_300._28_4_;
    fVar120 = local_480._0_4_;
    fVar121 = local_480._4_4_;
    fVar122 = local_480._8_4_;
    fVar123 = local_480._12_4_;
    fVar387 = local_480._16_4_;
    fVar389 = local_480._20_4_;
    fVar391 = local_480._24_4_;
    auVar40._4_4_ = auVar20._4_4_ * fVar121 * 4.0;
    auVar40._0_4_ = auVar20._0_4_ * fVar120 * 4.0;
    auVar40._8_4_ = auVar20._8_4_ * fVar122 * 4.0;
    auVar40._12_4_ = auVar20._12_4_ * fVar123 * 4.0;
    auVar40._16_4_ = auVar20._16_4_ * fVar387 * 4.0;
    auVar40._20_4_ = auVar20._20_4_ * fVar389 * 4.0;
    auVar40._24_4_ = auVar20._24_4_ * fVar391 * 4.0;
    auVar40._28_4_ = 0x40800000;
    auVar106 = vsubps_avx(auVar39,auVar40);
    auVar105 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,5);
    fVar226 = local_480._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar368._8_4_ = 0x7f800000;
      auVar368._0_8_ = 0x7f8000007f800000;
      auVar368._12_4_ = 0x7f800000;
      auVar368._16_4_ = 0x7f800000;
      auVar368._20_4_ = 0x7f800000;
      auVar368._24_4_ = 0x7f800000;
      auVar368._28_4_ = 0x7f800000;
      auVar346._8_4_ = 0xff800000;
      auVar346._0_8_ = 0xff800000ff800000;
      auVar346._12_4_ = 0xff800000;
      auVar346._16_4_ = 0xff800000;
      auVar346._20_4_ = 0xff800000;
      auVar346._24_4_ = 0xff800000;
      auVar346._28_4_ = 0xff800000;
      auVar256 = local_2c0;
    }
    else {
      auVar25 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,5);
      auVar218 = vsqrtps_avx(auVar106);
      auVar255._0_4_ = fVar120 + fVar120;
      auVar255._4_4_ = fVar121 + fVar121;
      auVar255._8_4_ = fVar122 + fVar122;
      auVar255._12_4_ = fVar123 + fVar123;
      auVar255._16_4_ = fVar387 + fVar387;
      auVar255._20_4_ = fVar389 + fVar389;
      auVar255._24_4_ = fVar391 + fVar391;
      auVar255._28_4_ = fVar226 + fVar226;
      auVar106 = vrcpps_avx(auVar255);
      fVar250 = auVar106._0_4_;
      fVar265 = auVar106._4_4_;
      auVar41._4_4_ = auVar255._4_4_ * fVar265;
      auVar41._0_4_ = auVar255._0_4_ * fVar250;
      fVar269 = auVar106._8_4_;
      auVar41._8_4_ = auVar255._8_4_ * fVar269;
      fVar273 = auVar106._12_4_;
      auVar41._12_4_ = auVar255._12_4_ * fVar273;
      fVar276 = auVar106._16_4_;
      auVar41._16_4_ = auVar255._16_4_ * fVar276;
      fVar279 = auVar106._20_4_;
      auVar41._20_4_ = auVar255._20_4_ * fVar279;
      fVar282 = auVar106._24_4_;
      auVar41._24_4_ = auVar255._24_4_ * fVar282;
      auVar41._28_4_ = auVar255._28_4_;
      auVar106 = vsubps_avx(auVar306,auVar41);
      fVar250 = fVar250 + fVar250 * auVar106._0_4_;
      fVar265 = fVar265 + fVar265 * auVar106._4_4_;
      fVar269 = fVar269 + fVar269 * auVar106._8_4_;
      fVar273 = fVar273 + fVar273 * auVar106._12_4_;
      fVar276 = fVar276 + fVar276 * auVar106._16_4_;
      fVar279 = fVar279 + fVar279 * auVar106._20_4_;
      fVar282 = fVar282 + fVar282 * auVar106._24_4_;
      auVar287._0_8_ = CONCAT44(fVar119,fVar248) ^ 0x8000000080000000;
      auVar287._8_4_ = -local_320._8_4_;
      auVar287._12_4_ = -local_320._12_4_;
      auVar287._16_4_ = -local_320._16_4_;
      auVar287._20_4_ = -local_320._20_4_;
      auVar287._24_4_ = -local_320._24_4_;
      auVar287._28_4_ = -local_320._28_4_;
      auVar106 = vsubps_avx(auVar287,auVar218);
      fVar248 = auVar106._0_4_ * fVar250;
      fVar119 = auVar106._4_4_ * fVar265;
      auVar42._4_4_ = fVar119;
      auVar42._0_4_ = fVar248;
      fVar293 = auVar106._8_4_ * fVar269;
      auVar42._8_4_ = fVar293;
      fVar295 = auVar106._12_4_ * fVar273;
      auVar42._12_4_ = fVar295;
      fVar297 = auVar106._16_4_ * fVar276;
      auVar42._16_4_ = fVar297;
      fVar299 = auVar106._20_4_ * fVar279;
      auVar42._20_4_ = fVar299;
      fVar301 = auVar106._24_4_ * fVar282;
      auVar42._24_4_ = fVar301;
      auVar42._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar218,local_320);
      fVar250 = auVar106._0_4_ * fVar250;
      fVar265 = auVar106._4_4_ * fVar265;
      auVar43._4_4_ = fVar265;
      auVar43._0_4_ = fVar250;
      fVar269 = auVar106._8_4_ * fVar269;
      auVar43._8_4_ = fVar269;
      fVar273 = auVar106._12_4_ * fVar273;
      auVar43._12_4_ = fVar273;
      fVar276 = auVar106._16_4_ * fVar276;
      auVar43._16_4_ = fVar276;
      fVar279 = auVar106._20_4_ * fVar279;
      auVar43._20_4_ = fVar279;
      fVar282 = auVar106._24_4_ * fVar282;
      auVar43._24_4_ = fVar282;
      auVar43._28_4_ = auVar106._28_4_;
      local_5e0._4_4_ = fVar267 * (fVar219 + fVar383 * fVar119);
      local_5e0._0_4_ = fVar249 * (fVar205 + fVar378 * fVar248);
      fStack_5d8 = fVar275 * (fVar220 + fVar384 * fVar293);
      fStack_5d4 = fVar294 * (fVar221 + fVar385 * fVar295);
      fStack_5d0 = fVar312 * (fVar222 + fVar386 * fVar297);
      fStack_5cc = fVar245 * (fVar223 + fVar388 * fVar299);
      fStack_5c8 = fVar247 * (fVar224 + fVar390 * fVar301);
      uStack_5c4 = 0x40800000;
      auVar338._8_4_ = 0x7fffffff;
      auVar338._0_8_ = 0x7fffffff7fffffff;
      auVar338._12_4_ = 0x7fffffff;
      auVar338._16_4_ = 0x7fffffff;
      auVar338._20_4_ = 0x7fffffff;
      auVar338._24_4_ = 0x7fffffff;
      auVar338._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar38,auVar338);
      auVar106 = vmaxps_avx(local_460,auVar106);
      auVar44._4_4_ = auVar106._4_4_ * 1.9073486e-06;
      auVar44._0_4_ = auVar106._0_4_ * 1.9073486e-06;
      auVar44._8_4_ = auVar106._8_4_ * 1.9073486e-06;
      auVar44._12_4_ = auVar106._12_4_ * 1.9073486e-06;
      auVar44._16_4_ = auVar106._16_4_ * 1.9073486e-06;
      auVar44._20_4_ = auVar106._20_4_ * 1.9073486e-06;
      auVar44._24_4_ = auVar106._24_4_ * 1.9073486e-06;
      auVar44._28_4_ = auVar106._28_4_;
      auVar106 = vandps_avx(local_480,auVar338);
      auVar106 = vcmpps_avx(auVar106,auVar44,1);
      auVar307._8_4_ = 0x7f800000;
      auVar307._0_8_ = 0x7f8000007f800000;
      auVar307._12_4_ = 0x7f800000;
      auVar307._16_4_ = 0x7f800000;
      auVar307._20_4_ = 0x7f800000;
      auVar307._24_4_ = 0x7f800000;
      auVar307._28_4_ = 0x7f800000;
      auVar368 = vblendvps_avx(auVar307,auVar42,auVar25);
      local_600 = fVar249 * (fVar205 + fVar378 * fVar250);
      fStack_5fc = fVar267 * (fVar219 + fVar383 * fVar265);
      fStack_5f8 = fVar275 * (fVar220 + fVar384 * fVar269);
      fStack_5f4 = fVar294 * (fVar221 + fVar385 * fVar273);
      fStack_5f0 = fVar312 * (fVar222 + fVar386 * fVar276);
      fStack_5ec = fVar245 * (fVar223 + fVar388 * fVar279);
      fStack_5e8 = fVar247 * (fVar224 + fVar390 * fVar282);
      uStack_5e4 = 0x40800000;
      auVar256._8_4_ = 0xff800000;
      auVar256._0_8_ = 0xff800000ff800000;
      auVar256._12_4_ = 0xff800000;
      auVar256._16_4_ = 0xff800000;
      auVar256._20_4_ = 0xff800000;
      auVar256._24_4_ = 0xff800000;
      auVar256._28_4_ = 0xff800000;
      auVar346 = vblendvps_avx(auVar256,auVar43,auVar25);
      auVar218 = auVar25 & auVar106;
      if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar218 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar218 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar218 >> 0x7f,0) != '\0') ||
            (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar218 >> 0xbf,0) != '\0') ||
          (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar218[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar106,auVar25);
        auVar188 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar218 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar256 = vcmpps_avx(auVar20,auVar218,2);
        auVar341._8_4_ = 0xff800000;
        auVar341._0_8_ = 0xff800000ff800000;
        auVar341._12_4_ = 0xff800000;
        auVar341._16_4_ = 0xff800000;
        auVar341._20_4_ = 0xff800000;
        auVar341._24_4_ = 0xff800000;
        auVar341._28_4_ = 0xff800000;
        auVar358._8_4_ = 0x7f800000;
        auVar358._0_8_ = 0x7f8000007f800000;
        auVar358._12_4_ = 0x7f800000;
        auVar358._16_4_ = 0x7f800000;
        auVar358._20_4_ = 0x7f800000;
        auVar358._24_4_ = 0x7f800000;
        auVar358._28_4_ = 0x7f800000;
        auVar359 = ZEXT3264(auVar358);
        auVar106 = vblendvps_avx(auVar358,auVar341,auVar256);
        auVar194 = vpmovsxwd_avx(auVar188);
        auVar188 = vpunpckhwd_avx(auVar188,auVar188);
        auVar237._16_16_ = auVar188;
        auVar237._0_16_ = auVar194;
        auVar368 = vblendvps_avx(auVar368,auVar106,auVar237);
        auVar289._8_4_ = 0xff800000;
        auVar289._0_8_ = 0xff800000ff800000;
        auVar289._12_4_ = 0xff800000;
        auVar289._16_4_ = 0xff800000;
        auVar289._20_4_ = 0xff800000;
        auVar289._24_4_ = 0xff800000;
        auVar289._28_4_ = 0xff800000;
        auVar106 = vblendvps_avx(auVar289,auVar358,auVar256);
        auVar346 = vblendvps_avx(auVar346,auVar106,auVar237);
        auVar106 = vcmpps_avx(auVar218,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
        auVar117._0_4_ = auVar105._0_4_ ^ auVar106._0_4_;
        auVar117._4_4_ = auVar105._4_4_ ^ auVar106._4_4_;
        auVar117._8_4_ = auVar105._8_4_ ^ auVar106._8_4_;
        auVar117._12_4_ = auVar105._12_4_ ^ auVar106._12_4_;
        auVar117._16_4_ = auVar105._16_4_ ^ auVar106._16_4_;
        auVar117._20_4_ = auVar105._20_4_ ^ auVar106._20_4_;
        auVar117._24_4_ = auVar105._24_4_ ^ auVar106._24_4_;
        auVar117._28_4_ = auVar105._28_4_ ^ auVar106._28_4_;
        auVar105 = vorps_avx(auVar256,auVar117);
        auVar105 = vandps_avx(auVar25,auVar105);
      }
    }
    auVar347 = ZEXT3264(auVar346);
    auVar261 = ZEXT3264(auVar256);
    auVar343 = ZEXT3264(CONCAT428(fStack_744,
                                  CONCAT424(fStack_748,
                                            CONCAT420(fStack_74c,
                                                      CONCAT416(fStack_750,
                                                                CONCAT412(fStack_754,
                                                                          CONCAT48(fStack_758,
                                                                                   CONCAT44(
                                                  fStack_75c,local_760))))))));
    auVar106 = local_2e0 & auVar105;
    auVar290 = ZEXT3264(local_a80);
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0x7f,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar106 >> 0xbf,0) != '\0') ||
        (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar106[0x1f] < '\0') {
      auVar188 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_810._0_4_));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar231._16_16_ = auVar188;
      auVar231._0_16_ = auVar188;
      auVar25 = vmaxps_avx(auVar231,auVar368);
      auVar188 = ZEXT416((uint)(ray->tfar - (float)local_810._0_4_));
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar232._16_16_ = auVar188;
      auVar232._0_16_ = auVar188;
      auVar218 = vminps_avx(auVar232,auVar346);
      fVar279 = auVar24._28_4_;
      auVar168._0_4_ = local_560 * fVar355 + local_760 * fVar345 + fVar316 * local_780;
      auVar168._4_4_ = fStack_55c * fVar360 + fStack_75c * fVar348 + fVar323 * fStack_77c;
      auVar168._8_4_ = fStack_558 * fVar361 + fStack_758 * fVar349 + fVar325 * fStack_778;
      auVar168._12_4_ = fStack_554 * fVar362 + fStack_754 * fVar350 + fVar327 * fStack_774;
      auVar168._16_4_ = fStack_550 * fVar363 + fStack_750 * fVar351 + fVar329 * fStack_770;
      auVar168._20_4_ = fStack_54c * fVar364 + fStack_74c * fVar352 + fVar331 * fStack_76c;
      auVar168._24_4_ = fStack_548 * fVar365 + fStack_748 * fVar353 + fVar333 * fStack_768;
      auVar168._28_4_ = fVar279 + fVar279 + auVar23._28_4_;
      auVar106 = vrcpps_avx(auVar168);
      fVar248 = auVar106._0_4_;
      fVar119 = auVar106._4_4_;
      auVar45._4_4_ = auVar168._4_4_ * fVar119;
      auVar45._0_4_ = auVar168._0_4_ * fVar248;
      fVar250 = auVar106._8_4_;
      auVar45._8_4_ = auVar168._8_4_ * fVar250;
      fVar265 = auVar106._12_4_;
      auVar45._12_4_ = auVar168._12_4_ * fVar265;
      fVar269 = auVar106._16_4_;
      auVar45._16_4_ = auVar168._16_4_ * fVar269;
      fVar273 = auVar106._20_4_;
      auVar45._20_4_ = auVar168._20_4_ * fVar273;
      fVar276 = auVar106._24_4_;
      auVar45._24_4_ = auVar168._24_4_ * fVar276;
      auVar45._28_4_ = uStack_1c4;
      auVar369._8_4_ = 0x3f800000;
      auVar369._0_8_ = 0x3f8000003f800000;
      auVar369._12_4_ = 0x3f800000;
      auVar369._16_4_ = 0x3f800000;
      auVar369._20_4_ = 0x3f800000;
      auVar369._24_4_ = 0x3f800000;
      auVar369._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar369,auVar45);
      auVar321._8_4_ = 0x7fffffff;
      auVar321._0_8_ = 0x7fffffff7fffffff;
      auVar321._12_4_ = 0x7fffffff;
      auVar321._16_4_ = 0x7fffffff;
      auVar321._20_4_ = 0x7fffffff;
      auVar321._24_4_ = 0x7fffffff;
      auVar321._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar321,auVar168);
      auVar379._8_4_ = 0x219392ef;
      auVar379._0_8_ = 0x219392ef219392ef;
      auVar379._12_4_ = 0x219392ef;
      auVar379._16_4_ = 0x219392ef;
      auVar379._20_4_ = 0x219392ef;
      auVar379._24_4_ = 0x219392ef;
      auVar379._28_4_ = 0x219392ef;
      auVar106 = vcmpps_avx(auVar106,auVar379,1);
      auVar46._4_4_ =
           (fVar119 + fVar119 * auVar20._4_4_) *
           -(fVar360 * fVar264 + fVar348 * fVar263 + fVar323 * fVar242);
      auVar46._0_4_ =
           (fVar248 + fVar248 * auVar20._0_4_) *
           -(fVar355 * fVar204 + fVar345 * fVar241 + fVar316 * fVar203);
      auVar46._8_4_ =
           (fVar250 + fVar250 * auVar20._8_4_) *
           -(fVar361 * fVar274 + fVar349 * fVar272 + fVar325 * fVar271);
      auVar46._12_4_ =
           (fVar265 + fVar265 * auVar20._12_4_) *
           -(fVar362 * fVar292 + fVar350 * fVar291 + fVar327 * fVar283);
      auVar46._16_4_ =
           (fVar269 + fVar269 * auVar20._16_4_) *
           -(fVar363 * fVar311 + fVar351 * fVar310 + fVar329 * fVar309);
      auVar46._20_4_ =
           (fVar273 + fVar273 * auVar20._20_4_) *
           -(fVar364 * fVar10 + fVar352 * fVar354 + fVar331 * fVar336);
      auVar46._24_4_ =
           (fVar276 + fVar276 * auVar20._24_4_) *
           -(fVar365 * fVar17 + fVar353 * fVar16 + fVar333 * fVar15);
      auVar46._28_4_ = -(auVar23._28_4_ + local_320._28_4_ + fVar279);
      auVar20 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,1);
      auVar23 = vorps_avx(auVar106,auVar20);
      auVar20 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,6);
      auVar20 = vorps_avx(auVar106,auVar20);
      auVar339._8_4_ = 0xff800000;
      auVar339._0_8_ = 0xff800000ff800000;
      auVar339._12_4_ = 0xff800000;
      auVar339._16_4_ = 0xff800000;
      auVar339._20_4_ = 0xff800000;
      auVar339._24_4_ = 0xff800000;
      auVar339._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar46,auVar339,auVar23);
      auVar380._8_4_ = 0x7f800000;
      auVar380._0_8_ = 0x7f8000007f800000;
      auVar380._12_4_ = 0x7f800000;
      auVar380._16_4_ = 0x7f800000;
      auVar380._20_4_ = 0x7f800000;
      auVar380._24_4_ = 0x7f800000;
      auVar380._28_4_ = 0x7f800000;
      auVar20 = vblendvps_avx(auVar46,auVar380,auVar20);
      auVar23 = vmaxps_avx(auVar25,auVar106);
      auVar359 = ZEXT3264(CONCAT428(fStack_764,
                                    CONCAT424(fStack_768,
                                              CONCAT420(fStack_76c,
                                                        CONCAT416(fStack_770,
                                                                  CONCAT412(fStack_774,
                                                                            CONCAT48(fStack_778,
                                                                                     CONCAT44(
                                                  fStack_77c,local_780))))))));
      auVar25 = vminps_avx(auVar218,auVar20);
      auVar347 = ZEXT3264(auVar25);
      auVar288 = ZEXT832(0) << 0x20;
      auVar106 = vsubps_avx(auVar288,auVar18);
      auVar20 = vsubps_avx(auVar288,auVar198);
      auVar47._4_4_ = auVar20._4_4_ * -fVar344;
      auVar47._0_4_ = auVar20._0_4_ * -fVar240;
      auVar47._8_4_ = auVar20._8_4_ * -fVar246;
      auVar47._12_4_ = auVar20._12_4_ * -fVar281;
      auVar47._16_4_ = auVar20._16_4_ * -fVar302;
      auVar47._20_4_ = auVar20._20_4_ * -fVar335;
      auVar47._24_4_ = auVar20._24_4_ * -fVar14;
      auVar47._28_4_ = auVar20._28_4_;
      auVar48._4_4_ = fVar371 * auVar106._4_4_;
      auVar48._0_4_ = fVar366 * auVar106._0_4_;
      auVar48._8_4_ = fVar372 * auVar106._8_4_;
      auVar48._12_4_ = fVar373 * auVar106._12_4_;
      auVar48._16_4_ = fVar374 * auVar106._16_4_;
      auVar48._20_4_ = fVar375 * auVar106._20_4_;
      auVar48._24_4_ = fVar376 * auVar106._24_4_;
      auVar48._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar47,auVar48);
      auVar20 = vsubps_avx(auVar288,local_6c0);
      auVar322 = ZEXT3264(auVar105);
      auVar50._4_4_ = fVar324 * auVar20._4_4_;
      auVar50._0_4_ = fVar317 * auVar20._0_4_;
      auVar50._8_4_ = fVar326 * auVar20._8_4_;
      auVar50._12_4_ = fVar328 * auVar20._12_4_;
      auVar50._16_4_ = fVar330 * auVar20._16_4_;
      auVar50._20_4_ = fVar332 * auVar20._20_4_;
      uVar49 = auVar20._28_4_;
      auVar50._24_4_ = fVar334 * auVar20._24_4_;
      auVar50._28_4_ = uVar49;
      auVar218 = vsubps_avx(auVar106,auVar50);
      auVar51._4_4_ = fStack_77c * -fVar344;
      auVar51._0_4_ = local_780 * -fVar240;
      auVar51._8_4_ = fStack_778 * -fVar246;
      auVar51._12_4_ = fStack_774 * -fVar281;
      auVar51._16_4_ = fStack_770 * -fVar302;
      auVar51._20_4_ = fStack_76c * -fVar335;
      auVar51._24_4_ = fStack_768 * -fVar14;
      auVar51._28_4_ = local_700._28_4_ ^ 0x80000000;
      auVar52._4_4_ = fStack_75c * fVar371;
      auVar52._0_4_ = local_760 * fVar366;
      auVar52._8_4_ = fStack_758 * fVar372;
      auVar52._12_4_ = fStack_754 * fVar373;
      auVar52._16_4_ = fStack_750 * fVar374;
      auVar52._20_4_ = fStack_74c * fVar375;
      auVar52._24_4_ = fStack_748 * fVar376;
      auVar52._28_4_ = uVar49;
      auVar106 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fStack_55c * fVar324;
      auVar53._0_4_ = local_560 * fVar317;
      auVar53._8_4_ = fStack_558 * fVar326;
      auVar53._12_4_ = fStack_554 * fVar328;
      auVar53._16_4_ = fStack_550 * fVar330;
      auVar53._20_4_ = fStack_54c * fVar332;
      auVar53._24_4_ = fStack_548 * fVar334;
      auVar53._28_4_ = uVar49;
      auVar26 = vsubps_avx(auVar106,auVar53);
      auVar106 = vrcpps_avx(auVar26);
      fVar240 = auVar106._0_4_;
      fVar203 = auVar106._4_4_;
      auVar54._4_4_ = auVar26._4_4_ * fVar203;
      auVar54._0_4_ = auVar26._0_4_ * fVar240;
      fVar241 = auVar106._8_4_;
      auVar54._8_4_ = auVar26._8_4_ * fVar241;
      fVar204 = auVar106._12_4_;
      auVar54._12_4_ = auVar26._12_4_ * fVar204;
      fVar344 = auVar106._16_4_;
      auVar54._16_4_ = auVar26._16_4_ * fVar344;
      fVar242 = auVar106._20_4_;
      auVar54._20_4_ = auVar26._20_4_ * fVar242;
      fVar263 = auVar106._24_4_;
      auVar54._24_4_ = auVar26._24_4_ * fVar263;
      auVar54._28_4_ = fStack_544;
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar109,auVar54);
      auVar110._8_4_ = 0x7fffffff;
      auVar110._0_8_ = 0x7fffffff7fffffff;
      auVar110._12_4_ = 0x7fffffff;
      auVar110._16_4_ = 0x7fffffff;
      auVar110._20_4_ = 0x7fffffff;
      auVar110._24_4_ = 0x7fffffff;
      auVar110._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar26,auVar110);
      auVar111._8_4_ = 0x219392ef;
      auVar111._0_8_ = 0x219392ef219392ef;
      auVar111._12_4_ = 0x219392ef;
      auVar111._16_4_ = 0x219392ef;
      auVar111._20_4_ = 0x219392ef;
      auVar111._24_4_ = 0x219392ef;
      auVar111._28_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar106,auVar111,1);
      auVar261 = ZEXT3264(auVar20);
      auVar55._4_4_ = (fVar203 + fVar203 * auVar27._4_4_) * -auVar218._4_4_;
      auVar55._0_4_ = (fVar240 + fVar240 * auVar27._0_4_) * -auVar218._0_4_;
      auVar55._8_4_ = (fVar241 + fVar241 * auVar27._8_4_) * -auVar218._8_4_;
      auVar55._12_4_ = (fVar204 + fVar204 * auVar27._12_4_) * -auVar218._12_4_;
      auVar55._16_4_ = (fVar344 + fVar344 * auVar27._16_4_) * -auVar218._16_4_;
      auVar55._20_4_ = (fVar242 + fVar242 * auVar27._20_4_) * -auVar218._20_4_;
      auVar55._24_4_ = (fVar263 + fVar263 * auVar27._24_4_) * -auVar218._24_4_;
      auVar55._28_4_ = auVar218._28_4_ ^ 0x80000000;
      auVar106 = vcmpps_avx(auVar26,auVar288,1);
      auVar106 = vorps_avx(auVar20,auVar106);
      auVar106 = vblendvps_avx(auVar55,auVar339,auVar106);
      _local_920 = vmaxps_avx(auVar23,auVar106);
      auVar106 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,6);
      auVar106 = vorps_avx(auVar20,auVar106);
      auVar106 = vblendvps_avx(auVar55,auVar380,auVar106);
      auVar105 = vandps_avx(auVar105,local_2e0);
      local_4e0 = vminps_avx(auVar25,auVar106);
      auVar106 = vcmpps_avx(_local_920,local_4e0,2);
      auVar20 = auVar105 & auVar106;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar20 = vminps_avx(_local_ac0,auVar108);
        auVar169 = vminps_avx(auVar169,auVar22);
        auVar169 = vminps_avx(auVar20,auVar169);
        auVar19 = vsubps_avx(auVar169,auVar19);
        auVar105 = vandps_avx(auVar106,auVar105);
        auVar381._8_4_ = 0x3f800000;
        auVar381._0_8_ = 0x3f8000003f800000;
        auVar381._12_4_ = 0x3f800000;
        auVar381._16_4_ = 0x3f800000;
        auVar381._20_4_ = 0x3f800000;
        auVar381._24_4_ = 0x3f800000;
        auVar381._28_4_ = 0x3f800000;
        auVar106 = vminps_avx(_local_5e0,auVar381);
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar156 + fVar124 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar179 + fVar142 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar180 + fVar145 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar181 + fVar149 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar156 + fVar124 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar179 + fVar142 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar180 + fVar145 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar181 + auVar106._28_4_ + 7.0;
        auVar76._4_4_ = fStack_5fc;
        auVar76._0_4_ = local_600;
        auVar76._8_4_ = fStack_5f8;
        auVar76._12_4_ = fStack_5f4;
        auVar76._16_4_ = fStack_5f0;
        auVar76._20_4_ = fStack_5ec;
        auVar76._24_4_ = fStack_5e8;
        auVar76._28_4_ = uStack_5e4;
        auVar106 = vminps_avx(auVar76,auVar381);
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar156 + fVar124 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar179 + fVar142 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar180 + fVar145 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar181 + fVar149 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar156 + fVar124 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar179 + fVar142 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar180 + fVar145 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar181 + auVar106._28_4_ + 7.0;
        auVar56._4_4_ = auVar19._4_4_ * 0.99999976;
        auVar56._0_4_ = auVar19._0_4_ * 0.99999976;
        auVar56._8_4_ = auVar19._8_4_ * 0.99999976;
        auVar56._12_4_ = auVar19._12_4_ * 0.99999976;
        auVar56._16_4_ = auVar19._16_4_ * 0.99999976;
        auVar56._20_4_ = auVar19._20_4_ * 0.99999976;
        auVar56._24_4_ = auVar19._24_4_ * 0.99999976;
        auVar56._28_4_ = 0x3f7ffffc;
        auVar106 = vmaxps_avx(ZEXT832(0) << 0x20,auVar56);
        auVar57._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar57._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar57._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar57._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar57._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar57._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar57._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar57._28_4_ = auVar106._28_4_;
        local_9e0 = vsubps_avx(auVar24,auVar57);
        auVar58._4_4_ = local_9e0._4_4_ * fVar121 * 4.0;
        auVar58._0_4_ = local_9e0._0_4_ * fVar120 * 4.0;
        auVar58._8_4_ = local_9e0._8_4_ * fVar122 * 4.0;
        auVar58._12_4_ = local_9e0._12_4_ * fVar123 * 4.0;
        auVar58._16_4_ = local_9e0._16_4_ * fVar387 * 4.0;
        auVar58._20_4_ = local_9e0._20_4_ * fVar389 * 4.0;
        auVar58._24_4_ = local_9e0._24_4_ * fVar391 * 4.0;
        auVar58._28_4_ = auVar106._28_4_;
        auVar19 = vsubps_avx(auVar39,auVar58);
        local_840 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,5);
        auVar106 = local_840;
        if ((((((((local_840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_840 >> 0x7f,0) == '\0') &&
              (local_840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_840 >> 0xbf,0) == '\0') &&
            (local_840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_840[0x1f]) {
          _local_640 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_7c0 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar169 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar347 = ZEXT864(0) << 0x20;
          auVar197 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar257._8_4_ = 0xff800000;
          auVar257._0_8_ = 0xff800000ff800000;
          auVar257._12_4_ = 0xff800000;
          auVar257._16_4_ = 0xff800000;
          auVar257._20_4_ = 0xff800000;
          auVar257._24_4_ = 0xff800000;
          auVar257._28_4_ = 0xff800000;
          local_9e0 = auVar198;
          local_840 = auVar18;
          _local_620 = _local_640;
        }
        else {
          auVar198 = vsqrtps_avx(auVar19);
          auVar170._0_4_ = fVar120 + fVar120;
          auVar170._4_4_ = fVar121 + fVar121;
          auVar170._8_4_ = fVar122 + fVar122;
          auVar170._12_4_ = fVar123 + fVar123;
          auVar170._16_4_ = fVar387 + fVar387;
          auVar170._20_4_ = fVar389 + fVar389;
          auVar170._24_4_ = fVar391 + fVar391;
          auVar170._28_4_ = fVar226 + fVar226;
          auVar18 = vrcpps_avx(auVar170);
          fVar226 = auVar18._0_4_;
          fVar240 = auVar18._4_4_;
          auVar59._4_4_ = auVar170._4_4_ * fVar240;
          auVar59._0_4_ = auVar170._0_4_ * fVar226;
          fVar203 = auVar18._8_4_;
          auVar59._8_4_ = auVar170._8_4_ * fVar203;
          fVar241 = auVar18._12_4_;
          auVar59._12_4_ = auVar170._12_4_ * fVar241;
          fVar204 = auVar18._16_4_;
          auVar59._16_4_ = auVar170._16_4_ * fVar204;
          fVar344 = auVar18._20_4_;
          auVar59._20_4_ = auVar170._20_4_ * fVar344;
          fVar242 = auVar18._24_4_;
          auVar59._24_4_ = auVar170._24_4_ * fVar242;
          auVar59._28_4_ = auVar170._28_4_;
          auVar169 = vsubps_avx(auVar381,auVar59);
          fVar226 = fVar226 + fVar226 * auVar169._0_4_;
          fVar240 = fVar240 + fVar240 * auVar169._4_4_;
          fVar203 = fVar203 + fVar203 * auVar169._8_4_;
          fVar241 = fVar241 + fVar241 * auVar169._12_4_;
          fVar204 = fVar204 + fVar204 * auVar169._16_4_;
          fVar344 = fVar344 + fVar344 * auVar169._20_4_;
          fVar242 = fVar242 + fVar242 * auVar169._24_4_;
          fVar263 = auVar18._28_4_ + auVar169._28_4_;
          auVar199._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
          auVar199._8_4_ = -local_320._8_4_;
          auVar199._12_4_ = -local_320._12_4_;
          auVar199._16_4_ = -local_320._16_4_;
          auVar199._20_4_ = -local_320._20_4_;
          auVar199._24_4_ = -local_320._24_4_;
          auVar199._28_4_ = -local_320._28_4_;
          auVar18 = vsubps_avx(auVar199,auVar198);
          fVar291 = auVar18._0_4_ * fVar226;
          fVar292 = auVar18._4_4_ * fVar240;
          auVar60._4_4_ = fVar292;
          auVar60._0_4_ = fVar291;
          fVar302 = auVar18._8_4_ * fVar203;
          auVar60._8_4_ = fVar302;
          fVar309 = auVar18._12_4_ * fVar241;
          auVar60._12_4_ = fVar309;
          fVar310 = auVar18._16_4_ * fVar204;
          auVar60._16_4_ = fVar310;
          fVar311 = auVar18._20_4_ * fVar344;
          auVar60._20_4_ = fVar311;
          fVar335 = auVar18._24_4_ * fVar242;
          auVar60._24_4_ = fVar335;
          auVar60._28_4_ = auVar105._28_4_;
          auVar198 = vsubps_avx(auVar198,local_320);
          fVar226 = auVar198._0_4_ * fVar226;
          fVar240 = auVar198._4_4_ * fVar240;
          auVar61._4_4_ = fVar240;
          auVar61._0_4_ = fVar226;
          fVar203 = auVar198._8_4_ * fVar203;
          auVar61._8_4_ = fVar203;
          fVar241 = auVar198._12_4_ * fVar241;
          auVar61._12_4_ = fVar241;
          fVar204 = auVar198._16_4_ * fVar204;
          auVar61._16_4_ = fVar204;
          fVar344 = auVar198._20_4_ * fVar344;
          auVar61._20_4_ = fVar344;
          fVar242 = auVar198._24_4_ * fVar242;
          auVar61._24_4_ = fVar242;
          auVar61._28_4_ = fStack_764;
          auVar359 = ZEXT3264(auVar61);
          fVar264 = fVar249 * (fVar291 * fVar378 + fVar205);
          fVar246 = fVar267 * (fVar292 * fVar383 + fVar219);
          fVar271 = fVar275 * (fVar302 * fVar384 + fVar220);
          fVar272 = fVar294 * (fVar309 * fVar385 + fVar221);
          fVar274 = fVar312 * (fVar310 * fVar386 + fVar222);
          fVar281 = fVar245 * (fVar311 * fVar388 + fVar223);
          fVar283 = fVar247 * (fVar335 * fVar390 + fVar224);
          local_680._28_4_ = auVar21._28_4_;
          auVar135._0_4_ = local_880 + fVar202 * fVar264;
          auVar135._4_4_ = fStack_87c + fVar270 * fVar246;
          auVar135._8_4_ = fStack_878 + fVar244 * fVar271;
          auVar135._12_4_ = fStack_874 + fVar280 * fVar272;
          auVar135._16_4_ = fStack_870 + fVar300 * fVar274;
          auVar135._20_4_ = fStack_86c + fVar315 * fVar281;
          auVar135._24_4_ = fStack_868 + fVar13 * fVar283;
          auVar135._28_4_ = fStack_864 + auVar198._28_4_ + fVar225;
          auVar62._4_4_ = fStack_55c * fVar292;
          auVar62._0_4_ = local_560 * fVar291;
          auVar62._8_4_ = fStack_558 * fVar302;
          auVar62._12_4_ = fStack_554 * fVar309;
          auVar62._16_4_ = fStack_550 * fVar310;
          auVar62._20_4_ = fStack_54c * fVar311;
          auVar62._24_4_ = fStack_548 * fVar335;
          auVar62._28_4_ = fVar263;
          auVar169 = vsubps_avx(auVar62,auVar135);
          auVar171._0_4_ = fVar125 + fVar182 * fVar264;
          auVar171._4_4_ = fVar143 + fVar262 * fVar246;
          auVar171._8_4_ = fVar146 + fVar268 * fVar271;
          auVar171._12_4_ = fVar150 + fVar277 * fVar272;
          auVar171._16_4_ = fVar152 + fVar296 * fVar274;
          auVar171._20_4_ = fVar153 + fVar313 * fVar281;
          auVar171._24_4_ = fVar154 + fVar11 * fVar283;
          auVar171._28_4_ = fVar155 + fVar263;
          auVar234._0_4_ = local_760 * fVar291;
          auVar234._4_4_ = fStack_75c * fVar292;
          auVar234._8_4_ = fStack_758 * fVar302;
          auVar234._12_4_ = fStack_754 * fVar309;
          auVar234._16_4_ = fStack_750 * fVar310;
          auVar234._20_4_ = fStack_74c * fVar311;
          auVar234._24_4_ = fStack_748 * fVar335;
          auVar234._28_4_ = 0;
          auVar198 = vsubps_avx(auVar234,auVar171);
          auVar200._0_4_ = fVar126 + fVar239 * fVar264;
          auVar200._4_4_ = fVar144 + fVar266 * fVar246;
          auVar200._8_4_ = fVar147 + fVar243 * fVar271;
          auVar200._12_4_ = fVar151 + fVar278 * fVar272;
          auVar200._16_4_ = fStack_850 + fVar298 * fVar274;
          auVar200._20_4_ = fStack_84c + fVar314 * fVar281;
          auVar200._24_4_ = fStack_848 + fVar12 * fVar283;
          auVar200._28_4_ = fStack_844 + auVar18._28_4_;
          auVar63._4_4_ = fVar292 * fStack_77c;
          auVar63._0_4_ = fVar291 * local_780;
          auVar63._8_4_ = fVar302 * fStack_778;
          auVar63._12_4_ = fVar309 * fStack_774;
          auVar63._16_4_ = fVar310 * fStack_770;
          auVar63._20_4_ = fVar311 * fStack_76c;
          auVar63._24_4_ = fVar335 * fStack_768;
          auVar63._28_4_ = 0;
          auVar18 = vsubps_avx(auVar63,auVar200);
          auVar197 = auVar18._0_28_;
          fVar249 = fVar249 * (fVar226 * fVar378 + fVar205);
          fVar267 = fVar267 * (fVar240 * fVar383 + fVar219);
          fVar275 = fVar275 * (fVar203 * fVar384 + fVar220);
          fVar294 = fVar294 * (fVar241 * fVar385 + fVar221);
          fVar312 = fVar312 * (fVar204 * fVar386 + fVar222);
          fVar245 = fVar245 * (fVar344 * fVar388 + fVar223);
          fVar247 = fVar247 * (fVar242 * fVar390 + fVar224);
          auVar258._0_4_ = local_880 + fVar202 * fVar249;
          auVar258._4_4_ = fStack_87c + fVar270 * fVar267;
          auVar258._8_4_ = fStack_878 + fVar244 * fVar275;
          auVar258._12_4_ = fStack_874 + fVar280 * fVar294;
          auVar258._16_4_ = fStack_870 + fVar300 * fVar312;
          auVar258._20_4_ = fStack_86c + fVar315 * fVar245;
          auVar258._24_4_ = fStack_868 + fVar13 * fVar247;
          auVar258._28_4_ = fStack_864 + (float)local_680._28_4_;
          auVar64._4_4_ = fStack_55c * fVar240;
          auVar64._0_4_ = local_560 * fVar226;
          auVar64._8_4_ = fStack_558 * fVar203;
          auVar64._12_4_ = fStack_554 * fVar241;
          auVar64._16_4_ = fStack_550 * fVar204;
          auVar64._20_4_ = fStack_54c * fVar344;
          auVar64._24_4_ = fStack_548 * fVar242;
          auVar64._28_4_ = fStack_864;
          _local_620 = vsubps_avx(auVar64,auVar258);
          auVar259._0_4_ = fVar125 + fVar182 * fVar249;
          auVar259._4_4_ = fVar143 + fVar262 * fVar267;
          auVar259._8_4_ = fVar146 + fVar268 * fVar275;
          auVar259._12_4_ = fVar150 + fVar277 * fVar294;
          auVar259._16_4_ = fVar152 + fVar296 * fVar312;
          auVar259._20_4_ = fVar153 + fVar313 * fVar245;
          auVar259._24_4_ = fVar154 + fVar11 * fVar247;
          auVar259._28_4_ = fVar155 + local_620._28_4_;
          auVar65._4_4_ = fStack_75c * fVar240;
          auVar65._0_4_ = local_760 * fVar226;
          auVar65._8_4_ = fStack_758 * fVar203;
          auVar65._12_4_ = fStack_754 * fVar241;
          auVar65._16_4_ = fStack_750 * fVar204;
          auVar65._20_4_ = fStack_74c * fVar344;
          auVar65._24_4_ = fStack_748 * fVar242;
          auVar65._28_4_ = fStack_864;
          _local_640 = vsubps_avx(auVar65,auVar259);
          auVar235._0_4_ = fVar126 + fVar239 * fVar249;
          auVar235._4_4_ = fVar144 + fVar266 * fVar267;
          auVar235._8_4_ = fVar147 + fVar243 * fVar275;
          auVar235._12_4_ = fVar151 + fVar278 * fVar294;
          auVar235._16_4_ = fStack_850 + fVar298 * fVar312;
          auVar235._20_4_ = fStack_84c + fVar314 * fVar245;
          auVar235._24_4_ = fStack_848 + fVar12 * fVar247;
          auVar235._28_4_ = fStack_844 + fVar225 + 0.0;
          auVar66._4_4_ = fVar240 * fStack_77c;
          auVar66._0_4_ = fVar226 * local_780;
          auVar66._8_4_ = fVar203 * fStack_778;
          auVar66._12_4_ = fVar241 * fStack_774;
          auVar66._16_4_ = fVar204 * fStack_770;
          auVar66._20_4_ = fVar344 * fStack_76c;
          auVar66._24_4_ = fVar242 * fStack_768;
          auVar66._28_4_ = local_640._28_4_;
          _local_7c0 = vsubps_avx(auVar66,auVar235);
          auVar18 = vcmpps_avx(auVar19,_DAT_01faff00,5);
          auVar236._8_4_ = 0x7f800000;
          auVar236._0_8_ = 0x7f8000007f800000;
          auVar236._12_4_ = 0x7f800000;
          auVar236._16_4_ = 0x7f800000;
          auVar236._20_4_ = 0x7f800000;
          auVar236._24_4_ = 0x7f800000;
          auVar236._28_4_ = 0x7f800000;
          auVar233 = vblendvps_avx(auVar236,auVar60,auVar18);
          auVar340._8_4_ = 0x7fffffff;
          auVar340._0_8_ = 0x7fffffff7fffffff;
          auVar340._12_4_ = 0x7fffffff;
          auVar340._16_4_ = 0x7fffffff;
          auVar340._20_4_ = 0x7fffffff;
          auVar340._24_4_ = 0x7fffffff;
          auVar340._28_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar340,auVar38);
          auVar19 = vmaxps_avx(local_460,auVar19);
          auVar67._4_4_ = auVar19._4_4_ * 1.9073486e-06;
          auVar67._0_4_ = auVar19._0_4_ * 1.9073486e-06;
          auVar67._8_4_ = auVar19._8_4_ * 1.9073486e-06;
          auVar67._12_4_ = auVar19._12_4_ * 1.9073486e-06;
          auVar67._16_4_ = auVar19._16_4_ * 1.9073486e-06;
          auVar67._20_4_ = auVar19._20_4_ * 1.9073486e-06;
          auVar67._24_4_ = auVar19._24_4_ * 1.9073486e-06;
          auVar67._28_4_ = auVar19._28_4_;
          auVar19 = vandps_avx(auVar340,local_480);
          auVar19 = vcmpps_avx(auVar19,auVar67,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar257 = vblendvps_avx(auVar260,auVar61,auVar18);
          auVar22 = auVar18 & auVar19;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar106 = vandps_avx(auVar19,auVar18);
            auVar188 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar22 = vcmpps_avx(local_9e0,ZEXT832(0) << 0x20,2);
            auVar382._8_4_ = 0xff800000;
            auVar382._0_8_ = 0xff800000ff800000;
            auVar382._12_4_ = 0xff800000;
            auVar382._16_4_ = 0xff800000;
            auVar382._20_4_ = 0xff800000;
            auVar382._24_4_ = 0xff800000;
            auVar382._28_4_ = 0xff800000;
            auVar370._8_4_ = 0x7f800000;
            auVar370._0_8_ = 0x7f8000007f800000;
            auVar370._12_4_ = 0x7f800000;
            auVar370._16_4_ = 0x7f800000;
            auVar370._20_4_ = 0x7f800000;
            auVar370._24_4_ = 0x7f800000;
            auVar370._28_4_ = 0x7f800000;
            auVar19 = vblendvps_avx(auVar370,auVar382,auVar22);
            auVar194 = vpmovsxwd_avx(auVar188);
            auVar359 = ZEXT1664(auVar194);
            auVar188 = vpunpckhwd_avx(auVar188,auVar188);
            auVar342._16_16_ = auVar188;
            auVar342._0_16_ = auVar194;
            auVar233 = vblendvps_avx(auVar233,auVar19,auVar342);
            auVar19 = vblendvps_avx(auVar382,auVar370,auVar22);
            auVar257 = vblendvps_avx(auVar257,auVar19,auVar342);
            auVar19 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar118._0_4_ = auVar19._0_4_ ^ auVar106._0_4_;
            auVar118._4_4_ = auVar19._4_4_ ^ auVar106._4_4_;
            auVar118._8_4_ = auVar19._8_4_ ^ auVar106._8_4_;
            auVar118._12_4_ = auVar19._12_4_ ^ auVar106._12_4_;
            auVar118._16_4_ = auVar19._16_4_ ^ auVar106._16_4_;
            auVar118._20_4_ = auVar19._20_4_ ^ auVar106._20_4_;
            auVar118._24_4_ = auVar19._24_4_ ^ auVar106._24_4_;
            auVar118._28_4_ = auVar19._28_4_ ^ auVar106._28_4_;
            auVar106 = vorps_avx(auVar22,auVar118);
            auVar106 = vandps_avx(auVar18,auVar106);
          }
          auVar347 = ZEXT3264(auVar198);
          _local_a60 = auVar169;
        }
        auVar343 = ZEXT3264(_local_920);
        fStack_59c = (ray->dir).field_0.m128[0];
        local_900._0_4_ = (ray->dir).field_0.m128[1];
        fVar226 = (ray->dir).field_0.m128[2];
        auVar320._4_4_ = fVar226;
        auVar320._0_4_ = fVar226;
        auVar320._8_4_ = fVar226;
        auVar320._12_4_ = fVar226;
        auVar320._16_4_ = fVar226;
        auVar320._20_4_ = fVar226;
        auVar320._24_4_ = fVar226;
        fStack_924 = fVar226;
        _local_940 = auVar320;
        auVar322 = ZEXT3264(_local_940);
        local_4c0 = _local_920;
        local_4a0 = vminps_avx(local_4e0,auVar233);
        local_680 = vmaxps_avx(_local_920,auVar257);
        auVar261 = ZEXT3264(local_680);
        _local_500 = local_680;
        auVar19 = vcmpps_avx(_local_920,local_4a0,2);
        local_660 = vandps_avx(auVar105,auVar19);
        auVar19 = vcmpps_avx(local_680,local_4e0,2);
        local_5c0 = vandps_avx(auVar105,auVar19);
        auVar105 = vorps_avx(local_5c0,local_660);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          auVar105 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_7e0._0_4_ = auVar106._0_4_ ^ auVar105._0_4_;
          local_7e0._4_4_ = auVar106._4_4_ ^ auVar105._4_4_;
          local_7e0._8_4_ = auVar106._8_4_ ^ auVar105._8_4_;
          local_7e0._12_4_ = auVar106._12_4_ ^ auVar105._12_4_;
          local_7e0._16_4_ = auVar106._16_4_ ^ auVar105._16_4_;
          local_7e0._20_4_ = auVar106._20_4_ ^ auVar105._20_4_;
          local_7e0._24_4_ = auVar106._24_4_ ^ auVar105._24_4_;
          local_7e0._28_4_ = (uint)auVar106._28_4_ ^ auVar105._28_4_;
          local_5a0 = fStack_59c;
          fStack_598 = fStack_59c;
          fStack_594 = fStack_59c;
          fStack_590 = fStack_59c;
          fStack_58c = fStack_59c;
          fStack_588 = fStack_59c;
          fStack_584 = fStack_59c;
          auVar113._0_4_ =
               auVar169._0_4_ * fStack_59c +
               auVar347._0_4_ * (float)local_900._0_4_ + fVar226 * auVar197._0_4_;
          auVar113._4_4_ =
               auVar169._4_4_ * fStack_59c +
               auVar347._4_4_ * (float)local_900._0_4_ + fVar226 * auVar197._4_4_;
          auVar113._8_4_ =
               auVar169._8_4_ * fStack_59c +
               auVar347._8_4_ * (float)local_900._0_4_ + fVar226 * auVar197._8_4_;
          auVar113._12_4_ =
               auVar169._12_4_ * fStack_59c +
               auVar347._12_4_ * (float)local_900._0_4_ + fVar226 * auVar197._12_4_;
          auVar113._16_4_ =
               auVar169._16_4_ * fStack_59c +
               auVar347._16_4_ * (float)local_900._0_4_ + fVar226 * auVar197._16_4_;
          auVar113._20_4_ =
               auVar169._20_4_ * fStack_59c +
               auVar347._20_4_ * (float)local_900._0_4_ + fVar226 * auVar197._20_4_;
          auVar113._24_4_ =
               auVar169._24_4_ * fStack_59c +
               auVar347._24_4_ * (float)local_900._0_4_ + fVar226 * auVar197._24_4_;
          auVar113._28_4_ = fStack_59c + auVar106._28_4_ + auVar169._28_4_;
          auVar137._8_4_ = 0x7fffffff;
          auVar137._0_8_ = 0x7fffffff7fffffff;
          auVar137._12_4_ = 0x7fffffff;
          auVar137._16_4_ = 0x7fffffff;
          auVar137._20_4_ = 0x7fffffff;
          auVar137._24_4_ = 0x7fffffff;
          auVar137._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar113,auVar137);
          auVar138._8_4_ = 0x3e99999a;
          auVar138._0_8_ = 0x3e99999a3e99999a;
          auVar138._12_4_ = 0x3e99999a;
          auVar138._16_4_ = 0x3e99999a;
          auVar138._20_4_ = 0x3e99999a;
          auVar138._24_4_ = 0x3e99999a;
          auVar138._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar138,1);
          auVar105 = vorps_avx(auVar105,local_7e0);
          auVar139._8_4_ = 3;
          auVar139._0_8_ = 0x300000003;
          auVar139._12_4_ = 3;
          auVar139._16_4_ = 3;
          auVar139._20_4_ = 3;
          auVar139._24_4_ = 3;
          auVar139._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar173,auVar139,auVar105);
          _local_5e0 = ZEXT432(local_b34);
          auVar194 = vpshufd_avx(ZEXT416(local_b34),0);
          fVar226 = 0.0;
          auVar188 = vpcmpgtd_avx(auVar105._16_16_,auVar194);
          local_600 = auVar194._0_4_;
          fStack_5fc = auVar194._4_4_;
          fStack_5f8 = auVar194._8_4_;
          fStack_5f4 = auVar194._12_4_;
          auVar194 = vpcmpgtd_avx(auVar105._0_16_,auVar194);
          auVar140._16_16_ = auVar188;
          auVar140._0_16_ = auVar194;
          local_580 = vblendps_avx(ZEXT1632(auVar194),auVar140,0xf0);
          local_540 = vandnps_avx(local_580,local_660);
          auVar238 = ZEXT3264(local_540);
          auVar105 = local_660 & ~local_580;
          auVar290 = ZEXT3264(local_a80);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
            fVar182 = ray->tfar;
            auVar114._4_4_ = fVar182;
            auVar114._0_4_ = fVar182;
            auVar114._8_4_ = fVar182;
            auVar114._12_4_ = fVar182;
            auVar114._16_4_ = fVar182;
            auVar114._20_4_ = fVar182;
            auVar114._24_4_ = fVar182;
            auVar114._28_4_ = fVar182;
            local_900._4_4_ = local_900._0_4_;
            fStack_8f8 = (float)local_900._0_4_;
            fStack_8f4 = (float)local_900._0_4_;
            fStack_8f0 = (float)local_900._0_4_;
            fStack_8ec = (float)local_900._0_4_;
            fStack_8e8 = (float)local_900._0_4_;
          }
          else {
            local_7a0._4_4_ = local_a80._4_4_ + (float)local_920._4_4_;
            local_7a0._0_4_ = local_a80._0_4_ + (float)local_920._0_4_;
            fStack_798 = local_a80._8_4_ + fStack_918;
            fStack_794 = local_a80._12_4_ + fStack_914;
            fStack_790 = local_a80._16_4_ + fStack_910;
            fStack_78c = local_a80._20_4_ + fStack_90c;
            fStack_788 = local_a80._24_4_ + fStack_908;
            fStack_784 = local_a80._28_4_ + fStack_904;
            local_900._4_4_ = local_900._0_4_;
            fStack_8f8 = (float)local_900._0_4_;
            fStack_8f4 = (float)local_900._0_4_;
            fStack_8f0 = (float)local_900._0_4_;
            fStack_8ec = (float)local_900._0_4_;
            fStack_8e8 = (float)local_900._0_4_;
            fStack_8e4 = (float)local_900._0_4_;
            do {
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar105 = auVar238._0_32_;
              auVar106 = vblendvps_avx(auVar115,_local_920,auVar105);
              auVar19 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar19 = vminps_avx(auVar106,auVar19);
              auVar18 = vshufpd_avx(auVar19,auVar19,5);
              auVar19 = vminps_avx(auVar19,auVar18);
              auVar18 = vperm2f128_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar19,auVar18);
              auVar106 = vcmpps_avx(auVar106,auVar19,0);
              auVar19 = auVar105 & auVar106;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar106,auVar105);
              }
              uVar79 = vmovmskps_avx(auVar105);
              uVar83 = 0;
              if (uVar79 != 0) {
                for (; (uVar79 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar82 = (ulong)uVar83;
              *(undefined4 *)(local_540 + uVar82 * 4) = 0;
              aVar3 = (ray->dir).field_0.field_1;
              local_860 = aVar3.x;
              fStack_85c = aVar3.y;
              fStack_858 = aVar3.z;
              aStack_854 = aVar3.field_3;
              auVar188 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar226 = local_1a0[uVar82];
              uVar83 = *(uint *)(local_4c0 + uVar82 * 4);
              if (auVar188._0_4_ < 0.0) {
                fVar182 = sqrtf(auVar188._0_4_);
              }
              else {
                auVar188 = vsqrtss_avx(auVar188,auVar188);
                fVar182 = auVar188._0_4_;
              }
              auVar194 = vminps_avx(_local_980,_local_9a0);
              auVar188 = vmaxps_avx(_local_980,_local_9a0);
              auVar99 = vminps_avx(_local_990,_local_9b0);
              auVar164 = vminps_avx(auVar194,auVar99);
              auVar194 = vmaxps_avx(_local_990,_local_9b0);
              auVar99 = vmaxps_avx(auVar188,auVar194);
              auVar185._8_4_ = 0x7fffffff;
              auVar185._0_8_ = 0x7fffffff7fffffff;
              auVar185._12_4_ = 0x7fffffff;
              auVar188 = vandps_avx(auVar164,auVar185);
              auVar194 = vandps_avx(auVar99,auVar185);
              auVar188 = vmaxps_avx(auVar188,auVar194);
              auVar194 = vmovshdup_avx(auVar188);
              auVar194 = vmaxss_avx(auVar194,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar194);
              local_880 = auVar188._0_4_ * 1.9073486e-06;
              local_6c0._0_4_ = fVar182 * 1.9073486e-06;
              local_740._0_16_ = vshufps_avx(auVar99,auVar99,0xff);
              auVar188 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar226),0x10);
              auVar322 = ZEXT1664(auVar188);
              bVar89 = true;
              uVar82 = 0;
              do {
                auVar319 = auVar322._0_16_;
                auVar194 = vmovshdup_avx(auVar319);
                fVar241 = auVar194._0_4_;
                fVar203 = 1.0 - fVar241;
                fVar226 = fVar203 * fVar203;
                fVar182 = fVar203 * fVar226;
                fVar239 = fVar241 * fVar241;
                fVar202 = fVar241 * fVar239;
                fVar240 = fVar241 * fVar203;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar202 * 0.16666667)),
                                       ZEXT416((uint)(fVar202 * 0.16666667)),0);
                auVar99 = ZEXT416((uint)((fVar202 * 4.0 + fVar182 +
                                         fVar241 * fVar240 * 12.0 + fVar203 * fVar240 * 6.0) *
                                        0.16666667));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar164 = ZEXT416((uint)((fVar182 * 4.0 + fVar202 +
                                          fVar203 * fVar240 * 12.0 + fVar241 * fVar240 * 6.0) *
                                         0.16666667));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar101 = vshufps_avx(auVar319,auVar319,0);
                auVar161._0_4_ = auVar101._0_4_ * local_860 + 0.0;
                auVar161._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
                auVar161._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
                auVar161._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
                auVar101 = vshufps_avx(ZEXT416((uint)(fVar182 * 0.16666667)),
                                       ZEXT416((uint)(fVar182 * 0.16666667)),0);
                auVar94._0_4_ =
                     auVar101._0_4_ * (float)local_980._0_4_ +
                     auVar164._0_4_ * (float)local_9a0._0_4_ +
                     auVar188._0_4_ * (float)local_9b0._0_4_ +
                     auVar99._0_4_ * (float)local_990._0_4_;
                auVar94._4_4_ =
                     auVar101._4_4_ * (float)local_980._4_4_ +
                     auVar164._4_4_ * (float)local_9a0._4_4_ +
                     auVar188._4_4_ * (float)local_9b0._4_4_ +
                     auVar99._4_4_ * (float)local_990._4_4_;
                auVar94._8_4_ =
                     auVar101._8_4_ * fStack_978 +
                     auVar164._8_4_ * fStack_998 +
                     auVar188._8_4_ * fStack_9a8 + auVar99._8_4_ * fStack_988;
                auVar94._12_4_ =
                     auVar101._12_4_ * fStack_974 +
                     auVar164._12_4_ * fStack_994 +
                     auVar188._12_4_ * fStack_9a4 + auVar99._12_4_ * fStack_984;
                local_840._0_16_ = auVar94;
                auVar188 = vsubps_avx(auVar161,auVar94);
                _local_a60 = auVar188;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                fVar182 = auVar188._0_4_;
                local_b20 = auVar322._0_4_;
                if (fVar182 < 0.0) {
                  local_9e0._0_16_ = auVar194;
                  local_a00._0_4_ = fVar239;
                  local_a20._0_4_ = fVar226;
                  local_a40._0_4_ = fVar240;
                  auVar343._0_4_ = sqrtf(fVar182);
                  auVar343._4_60_ = extraout_var;
                  auVar99 = auVar343._0_16_;
                  fVar239 = (float)local_a00._0_4_;
                  auVar194 = local_9e0._0_16_;
                  fVar240 = (float)local_a40._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar188,auVar188);
                  local_a20._0_4_ = fVar226;
                }
                auVar359 = ZEXT1664(auVar194);
                auVar343 = ZEXT1664(auVar99);
                fVar226 = auVar194._0_4_;
                auVar164 = vshufps_avx(ZEXT416((uint)(fVar239 * 0.5)),ZEXT416((uint)(fVar239 * 0.5))
                                       ,0);
                auVar101 = ZEXT416((uint)(((float)local_a20._0_4_ + fVar240 * 4.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar91 = ZEXT416((uint)((fVar226 * -fVar226 - fVar240 * 4.0) * 0.5));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar100 = ZEXT416((uint)(fVar203 * -fVar203 * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar304._0_4_ =
                     (float)local_980._0_4_ * auVar100._0_4_ +
                     (float)local_9a0._0_4_ * auVar91._0_4_ +
                     (float)local_9b0._0_4_ * auVar164._0_4_ +
                     (float)local_990._0_4_ * auVar101._0_4_;
                auVar304._4_4_ =
                     (float)local_980._4_4_ * auVar100._4_4_ +
                     (float)local_9a0._4_4_ * auVar91._4_4_ +
                     (float)local_9b0._4_4_ * auVar164._4_4_ +
                     (float)local_990._4_4_ * auVar101._4_4_;
                auVar304._8_4_ =
                     fStack_978 * auVar100._8_4_ +
                     fStack_998 * auVar91._8_4_ +
                     fStack_9a8 * auVar164._8_4_ + fStack_988 * auVar101._8_4_;
                auVar304._12_4_ =
                     fStack_974 * auVar100._12_4_ +
                     fStack_994 * auVar91._12_4_ +
                     fStack_9a4 * auVar164._12_4_ + fStack_984 * auVar101._12_4_;
                auVar164 = vshufps_avx(auVar319,auVar319,0x55);
                auVar101 = ZEXT416((uint)(fVar203 - (fVar226 + fVar226)));
                auVar91 = vshufps_avx(auVar101,auVar101,0);
                auVar101 = ZEXT416((uint)(fVar226 - (fVar203 + fVar203)));
                auVar100 = vshufps_avx(auVar101,auVar101,0);
                auVar133 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                auVar101 = vdpps_avx(auVar304,auVar304,0x7f);
                auVar129._0_4_ =
                     (float)local_980._0_4_ * auVar133._0_4_ +
                     (float)local_9a0._0_4_ * auVar100._0_4_ +
                     (float)local_9b0._0_4_ * auVar164._0_4_ +
                     (float)local_990._0_4_ * auVar91._0_4_;
                auVar129._4_4_ =
                     (float)local_980._4_4_ * auVar133._4_4_ +
                     (float)local_9a0._4_4_ * auVar100._4_4_ +
                     (float)local_9b0._4_4_ * auVar164._4_4_ +
                     (float)local_990._4_4_ * auVar91._4_4_;
                auVar129._8_4_ =
                     fStack_978 * auVar133._8_4_ +
                     fStack_998 * auVar100._8_4_ +
                     fStack_9a8 * auVar164._8_4_ + fStack_988 * auVar91._8_4_;
                auVar129._12_4_ =
                     fStack_974 * auVar133._12_4_ +
                     fStack_994 * auVar100._12_4_ +
                     fStack_9a4 * auVar164._12_4_ + fStack_984 * auVar91._12_4_;
                auVar164 = vblendps_avx(auVar101,_DAT_01f7aa10,0xe);
                auVar91 = vrsqrtss_avx(auVar164,auVar164);
                fVar239 = auVar91._0_4_;
                fVar226 = auVar101._0_4_;
                auVar91 = vdpps_avx(auVar304,auVar129,0x7f);
                auVar100 = vshufps_avx(auVar101,auVar101,0);
                auVar130._0_4_ = auVar129._0_4_ * auVar100._0_4_;
                auVar130._4_4_ = auVar129._4_4_ * auVar100._4_4_;
                auVar130._8_4_ = auVar129._8_4_ * auVar100._8_4_;
                auVar130._12_4_ = auVar129._12_4_ * auVar100._12_4_;
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar208._0_4_ = auVar304._0_4_ * auVar91._0_4_;
                auVar208._4_4_ = auVar304._4_4_ * auVar91._4_4_;
                auVar208._8_4_ = auVar304._8_4_ * auVar91._8_4_;
                auVar208._12_4_ = auVar304._12_4_ * auVar91._12_4_;
                auVar133 = vsubps_avx(auVar130,auVar208);
                auVar91 = vrcpss_avx(auVar164,auVar164);
                auVar164 = vmaxss_avx(ZEXT416((uint)local_880),
                                      ZEXT416((uint)(local_b20 * (float)local_6c0._0_4_)));
                auVar91 = ZEXT416((uint)(auVar91._0_4_ * (2.0 - fVar226 * auVar91._0_4_)));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                uVar68 = CONCAT44(auVar304._4_4_,auVar304._0_4_);
                local_a20._0_8_ = uVar68 ^ 0x8000000080000000;
                local_a20._8_4_ = -auVar304._8_4_;
                local_a20._12_4_ = -auVar304._12_4_;
                auVar100 = ZEXT416((uint)(fVar239 * 1.5 +
                                         fVar226 * -0.5 * fVar239 * fVar239 * fVar239));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar186._0_4_ = auVar100._0_4_ * auVar133._0_4_ * auVar91._0_4_;
                auVar186._4_4_ = auVar100._4_4_ * auVar133._4_4_ * auVar91._4_4_;
                auVar186._8_4_ = auVar100._8_4_ * auVar133._8_4_ * auVar91._8_4_;
                auVar186._12_4_ = auVar100._12_4_ * auVar133._12_4_ * auVar91._12_4_;
                auVar253._0_4_ = auVar304._0_4_ * auVar100._0_4_;
                auVar253._4_4_ = auVar304._4_4_ * auVar100._4_4_;
                auVar253._8_4_ = auVar304._8_4_ * auVar100._8_4_;
                auVar253._12_4_ = auVar304._12_4_ * auVar100._12_4_;
                local_9e0._0_4_ = auVar164._0_4_;
                if (fVar226 < 0.0) {
                  local_a00._0_4_ = auVar99._0_4_;
                  local_a40._0_16_ = auVar253;
                  local_8a0._0_16_ = auVar186;
                  auVar359 = ZEXT1664(auVar194);
                  fVar239 = sqrtf(fVar226);
                  auVar343 = ZEXT464((uint)local_a00._0_4_);
                  auVar186 = local_8a0._0_16_;
                  auVar253 = local_a40._0_16_;
                  fVar226 = (float)local_9e0._0_4_;
                }
                else {
                  auVar194 = vsqrtss_avx(auVar101,auVar101);
                  fVar239 = auVar194._0_4_;
                  fVar226 = auVar164._0_4_;
                }
                auVar194 = vdpps_avx(_local_a60,auVar253,0x7f);
                local_a00._0_4_ =
                     (local_880 / fVar239) * (auVar343._0_4_ + 1.0) +
                     auVar343._0_4_ * local_880 + fVar226;
                auVar99 = vdpps_avx(local_a20._0_16_,auVar253,0x7f);
                auVar164 = vdpps_avx(_local_a60,auVar186,0x7f);
                auVar72._4_4_ = fStack_85c;
                auVar72._0_4_ = local_860;
                auVar72._8_4_ = fStack_858;
                auVar72._12_4_ = aStack_854.a;
                auVar101 = vdpps_avx(auVar72,auVar253,0x7f);
                auVar91 = vdpps_avx(_local_a60,local_a20._0_16_,0x7f);
                fVar239 = auVar99._0_4_ + auVar164._0_4_;
                fVar202 = auVar194._0_4_;
                auVar95._0_4_ = fVar202 * fVar202;
                auVar95._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                auVar95._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                auVar95._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                auVar164 = vsubps_avx(auVar188,auVar95);
                local_a20._0_16_ = ZEXT416((uint)fVar239);
                auVar99 = vdpps_avx(_local_a60,auVar72,0x7f);
                fVar240 = auVar91._0_4_ - fVar202 * fVar239;
                fVar202 = auVar99._0_4_ - fVar202 * auVar101._0_4_;
                auVar99 = vrsqrtss_avx(auVar164,auVar164);
                fVar203 = auVar164._0_4_;
                fVar239 = auVar99._0_4_;
                fVar239 = fVar239 * 1.5 + fVar203 * -0.5 * fVar239 * fVar239 * fVar239;
                if (fVar203 < 0.0) {
                  local_a40._0_16_ = auVar194;
                  local_8a0._0_16_ = auVar101;
                  local_6e0._0_4_ = fVar240;
                  local_700._0_4_ = fVar202;
                  local_720._0_4_ = fVar239;
                  auVar343 = ZEXT1664(auVar343._0_16_);
                  auVar359 = ZEXT1664(auVar359._0_16_);
                  fVar203 = sqrtf(fVar203);
                  fVar239 = (float)local_720._0_4_;
                  fVar240 = (float)local_6e0._0_4_;
                  fVar202 = (float)local_700._0_4_;
                  auVar101 = local_8a0._0_16_;
                  auVar194 = local_a40._0_16_;
                  fVar226 = (float)local_9e0._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar164,auVar164);
                  fVar203 = auVar99._0_4_;
                }
                auVar347 = ZEXT1664(auVar304);
                auVar91 = vpermilps_avx(local_840._0_16_,0xff);
                auVar100 = vshufps_avx(auVar304,auVar304,0xff);
                fVar241 = fVar240 * fVar239 - auVar100._0_4_;
                auVar209._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar101._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar101._12_4_ ^ 0x80000000;
                auVar229._0_4_ = -fVar241;
                auVar229._4_4_ = 0x80000000;
                auVar229._8_4_ = 0x80000000;
                auVar229._12_4_ = 0x80000000;
                fVar240 = local_a20._0_4_ * fVar202 * fVar239;
                auVar261 = ZEXT464((uint)fVar240);
                auVar99 = vinsertps_avx(auVar229,ZEXT416((uint)(fVar202 * fVar239)),0x1c);
                auVar101 = vmovsldup_avx(ZEXT416((uint)(fVar240 - auVar101._0_4_ * fVar241)));
                auVar99 = vdivps_avx(auVar99,auVar101);
                auVar164 = vinsertps_avx(local_a20._0_16_,auVar209,0x10);
                auVar164 = vdivps_avx(auVar164,auVar101);
                auVar101 = vmovsldup_avx(auVar194);
                auVar133 = ZEXT416((uint)(fVar203 - auVar91._0_4_));
                auVar91 = vmovsldup_avx(auVar133);
                auVar162._0_4_ = auVar101._0_4_ * auVar99._0_4_ + auVar91._0_4_ * auVar164._0_4_;
                auVar162._4_4_ = auVar101._4_4_ * auVar99._4_4_ + auVar91._4_4_ * auVar164._4_4_;
                auVar162._8_4_ = auVar101._8_4_ * auVar99._8_4_ + auVar91._8_4_ * auVar164._8_4_;
                auVar162._12_4_ =
                     auVar101._12_4_ * auVar99._12_4_ + auVar91._12_4_ * auVar164._12_4_;
                auVar99 = vsubps_avx(auVar319,auVar162);
                auVar322 = ZEXT1664(auVar99);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar194 = vandps_avx(auVar194,auVar163);
                if (auVar194._0_4_ < (float)local_a00._0_4_) {
                  auVar187._8_4_ = 0x7fffffff;
                  auVar187._0_8_ = 0x7fffffff7fffffff;
                  auVar187._12_4_ = 0x7fffffff;
                  auVar194 = vandps_avx(auVar133,auVar187);
                  if (auVar194._0_4_ <
                      (float)local_740._0_4_ * 1.9073486e-06 + fVar226 + (float)local_a00._0_4_) {
                    fVar226 = auVar99._0_4_ + (float)local_810._0_4_;
                    bVar78 = 0;
                    bVar77 = 0;
                    if (fVar226 < (ray->org).field_0.m128[3]) goto LAB_00e1839c;
                    fVar239 = ray->tfar;
                    auVar290 = ZEXT3264(local_a80);
                    auVar320 = local_940._0_28_;
                    if (fVar239 < fVar226) goto LAB_00e183b7;
                    auVar194 = vmovshdup_avx(auVar99);
                    bVar78 = 0;
                    fVar202 = auVar194._0_4_;
                    if ((fVar202 < 0.0) || (1.0 < fVar202)) goto LAB_00e183b7;
                    auVar188 = vrsqrtss_avx(auVar188,auVar188);
                    fVar203 = auVar188._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar86].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      bVar78 = 0;
                      goto LAB_00e183a5;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar78 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_00e183a5;
                    auVar188 = ZEXT416((uint)(fVar203 * 1.5 +
                                             fVar182 * -0.5 * fVar203 * fVar203 * fVar203));
                    auVar188 = vshufps_avx(auVar188,auVar188,0);
                    auVar189._0_4_ = auVar188._0_4_ * (float)local_a60._0_4_;
                    auVar189._4_4_ = auVar188._4_4_ * (float)local_a60._4_4_;
                    auVar189._8_4_ = auVar188._8_4_ * fStack_a58;
                    auVar189._12_4_ = auVar188._12_4_ * fStack_a54;
                    auVar96._0_4_ = auVar304._0_4_ + auVar100._0_4_ * auVar189._0_4_;
                    auVar96._4_4_ = auVar304._4_4_ + auVar100._4_4_ * auVar189._4_4_;
                    auVar96._8_4_ = auVar304._8_4_ + auVar100._8_4_ * auVar189._8_4_;
                    auVar96._12_4_ = auVar304._12_4_ + auVar100._12_4_ * auVar189._12_4_;
                    auVar188 = vshufps_avx(auVar189,auVar189,0xc9);
                    auVar194 = vshufps_avx(auVar304,auVar304,0xc9);
                    auVar190._0_4_ = auVar194._0_4_ * auVar189._0_4_;
                    auVar190._4_4_ = auVar194._4_4_ * auVar189._4_4_;
                    auVar190._8_4_ = auVar194._8_4_ * auVar189._8_4_;
                    auVar190._12_4_ = auVar194._12_4_ * auVar189._12_4_;
                    auVar210._0_4_ = auVar304._0_4_ * auVar188._0_4_;
                    auVar210._4_4_ = auVar304._4_4_ * auVar188._4_4_;
                    auVar210._8_4_ = auVar304._8_4_ * auVar188._8_4_;
                    auVar210._12_4_ = auVar304._12_4_ * auVar188._12_4_;
                    auVar164 = vsubps_avx(auVar210,auVar190);
                    auVar188 = vshufps_avx(auVar164,auVar164,0xc9);
                    auVar194 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar211._0_4_ = auVar194._0_4_ * auVar188._0_4_;
                    auVar211._4_4_ = auVar194._4_4_ * auVar188._4_4_;
                    auVar211._8_4_ = auVar194._8_4_ * auVar188._8_4_;
                    auVar211._12_4_ = auVar194._12_4_ * auVar188._12_4_;
                    auVar188 = vshufps_avx(auVar164,auVar164,0xd2);
                    auVar97._0_4_ = auVar96._0_4_ * auVar188._0_4_;
                    auVar97._4_4_ = auVar96._4_4_ * auVar188._4_4_;
                    auVar97._8_4_ = auVar96._8_4_ * auVar188._8_4_;
                    auVar97._12_4_ = auVar96._12_4_ * auVar188._12_4_;
                    auVar194 = vsubps_avx(auVar211,auVar97);
                    auVar188 = vshufps_avx(auVar194,auVar194,0xe9);
                    local_8d0 = vmovlps_avx(auVar188);
                    local_8c8 = auVar194._0_4_;
                    local_8c0 = 0;
                    local_8b4 = context->user->instID[0];
                    local_8b0 = context->user->instPrimID[0];
                    ray->tfar = fVar226;
                    local_6a0._0_4_ = 0xffffffff;
                    local_970.valid = (int *)local_6a0;
                    local_970.geometryUserPtr = pGVar7->userPtr;
                    local_970.context = context->user;
                    local_970.hit = (RTCHitN *)&local_8d0;
                    local_970.N = 1;
                    local_970.ray = (RTCRayN *)ray;
                    local_8c4 = fVar202;
                    local_8bc = uVar1;
                    local_8b8 = uVar86;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e185e6:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar322 = ZEXT1664(auVar322._0_16_);
                        auVar343 = ZEXT1664(auVar343._0_16_);
                        auVar347 = ZEXT1664(auVar347._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        (*p_Var8)(&local_970);
                        if (*local_970.valid == 0) goto LAB_00e1862c;
                      }
                      bVar77 = 1;
                    }
                    else {
                      auVar261 = ZEXT464((uint)fVar240);
                      auVar322 = ZEXT1664(auVar99);
                      auVar343 = ZEXT1664(auVar343._0_16_);
                      auVar347 = ZEXT1664(auVar304);
                      auVar359 = ZEXT1664(auVar359._0_16_);
                      (*pGVar7->occlusionFilterN)(&local_970);
                      if (*local_970.valid != 0) goto LAB_00e185e6;
LAB_00e1862c:
                      ray->tfar = fVar239;
                      bVar77 = 0;
                    }
                    goto LAB_00e1839c;
                  }
                }
                bVar89 = uVar82 < 4;
                uVar82 = uVar82 + 1;
              } while (uVar82 != 5);
              bVar89 = false;
              bVar77 = 5;
LAB_00e1839c:
              bVar78 = bVar77;
              auVar290 = ZEXT3264(local_a80);
LAB_00e183a5:
              auVar320 = local_940._0_28_;
LAB_00e183b7:
              bVar88 = (bool)(bVar88 | bVar89 & bVar78);
              fVar226 = ray->tfar;
              auVar114._4_4_ = fVar226;
              auVar114._0_4_ = fVar226;
              auVar114._8_4_ = fVar226;
              auVar114._12_4_ = fVar226;
              auVar114._16_4_ = fVar226;
              auVar114._20_4_ = fVar226;
              auVar114._24_4_ = fVar226;
              auVar114._28_4_ = fVar226;
              auVar106 = vcmpps_avx(_local_7a0,auVar114,2);
              fVar226 = auVar106._28_4_;
              auVar105 = vandps_avx(auVar106,local_540);
              auVar238 = ZEXT3264(auVar105);
              auVar106 = local_540 & auVar106;
              local_540 = auVar105;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          auVar308 = ZEXT3264(_local_500);
          auVar141._0_4_ =
               local_5a0 * (float)local_620._0_4_ +
               (float)local_900._0_4_ * (float)local_640._0_4_ +
               auVar320._0_4_ * (float)local_7c0._0_4_;
          auVar141._4_4_ =
               fStack_59c * (float)local_620._4_4_ +
               (float)local_900._4_4_ * (float)local_640._4_4_ +
               auVar320._4_4_ * (float)local_7c0._4_4_;
          auVar141._8_4_ =
               fStack_598 * fStack_618 + fStack_8f8 * fStack_638 + auVar320._8_4_ * fStack_7b8;
          auVar141._12_4_ =
               fStack_594 * fStack_614 + fStack_8f4 * fStack_634 + auVar320._12_4_ * fStack_7b4;
          auVar141._16_4_ =
               fStack_590 * fStack_610 + fStack_8f0 * fStack_630 + auVar320._16_4_ * fStack_7b0;
          auVar141._20_4_ =
               fStack_58c * fStack_60c + fStack_8ec * fStack_62c + auVar320._20_4_ * fStack_7ac;
          auVar141._24_4_ =
               fStack_588 * fStack_608 + fStack_8e8 * fStack_628 + auVar320._24_4_ * fStack_7a8;
          auVar141._28_4_ = fStack_584 + fVar226 + auVar238._28_4_;
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar174._16_4_ = 0x7fffffff;
          auVar174._20_4_ = 0x7fffffff;
          auVar174._24_4_ = 0x7fffffff;
          auVar174._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar141,auVar174);
          auVar175._8_4_ = 0x3e99999a;
          auVar175._0_8_ = 0x3e99999a3e99999a;
          auVar175._12_4_ = 0x3e99999a;
          auVar175._16_4_ = 0x3e99999a;
          auVar175._20_4_ = 0x3e99999a;
          auVar175._24_4_ = 0x3e99999a;
          auVar175._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar175,1);
          auVar106 = vorps_avx(auVar105,local_7e0);
          auVar176._0_4_ = auVar290._0_4_ + local_680._0_4_;
          auVar176._4_4_ = auVar290._4_4_ + local_680._4_4_;
          auVar176._8_4_ = auVar290._8_4_ + local_680._8_4_;
          auVar176._12_4_ = auVar290._12_4_ + local_680._12_4_;
          auVar176._16_4_ = auVar290._16_4_ + local_680._16_4_;
          auVar176._20_4_ = auVar290._20_4_ + local_680._20_4_;
          auVar176._24_4_ = auVar290._24_4_ + local_680._24_4_;
          auVar176._28_4_ = auVar290._28_4_ + local_680._28_4_;
          auVar105 = vcmpps_avx(auVar176,auVar114,2);
          _local_7a0 = vandps_avx(auVar105,local_5c0);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar201._8_4_ = 2;
          auVar201._0_8_ = 0x200000002;
          auVar201._12_4_ = 2;
          auVar201._16_4_ = 2;
          auVar201._20_4_ = 2;
          auVar201._24_4_ = 2;
          auVar201._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar201,auVar177,auVar106);
          auVar75._4_4_ = fStack_5fc;
          auVar75._0_4_ = local_600;
          auVar75._8_4_ = fStack_5f8;
          auVar75._12_4_ = fStack_5f4;
          auVar188 = vpcmpgtd_avx(auVar105._16_16_,auVar75);
          auVar194 = vpshufd_avx(_local_5e0,0);
          auVar194 = vpcmpgtd_avx(auVar105._0_16_,auVar194);
          auVar178._16_16_ = auVar188;
          auVar178._0_16_ = auVar114._0_16_;
          _local_900 = vblendps_avx(ZEXT1632(auVar194),auVar178,0xf0);
          auVar105 = vandnps_avx(_local_900,_local_7a0);
          auVar106 = _local_7a0 & ~_local_900;
          local_6a0 = auVar105;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            local_940._4_4_ = local_500._4_4_ + auVar290._4_4_;
            local_940._0_4_ = local_500._0_4_ + auVar290._0_4_;
            fStack_938 = local_500._8_4_ + auVar290._8_4_;
            fStack_934 = local_500._12_4_ + auVar290._12_4_;
            fStack_930 = local_500._16_4_ + auVar290._16_4_;
            fStack_92c = local_500._20_4_ + auVar290._20_4_;
            fStack_928 = local_500._24_4_ + auVar290._24_4_;
            fStack_924 = local_500._28_4_ + auVar290._28_4_;
            _local_920 = _local_500;
            do {
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar106 = vblendvps_avx(auVar116,auVar308._0_32_,auVar105);
              auVar19 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar19 = vminps_avx(auVar106,auVar19);
              auVar18 = vshufpd_avx(auVar19,auVar19,5);
              auVar19 = vminps_avx(auVar19,auVar18);
              auVar18 = vperm2f128_avx(auVar19,auVar19,1);
              auVar19 = vminps_avx(auVar19,auVar18);
              auVar19 = vcmpps_avx(auVar106,auVar19,0);
              auVar18 = auVar105 & auVar19;
              auVar106 = auVar105;
              if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar18 >> 0x7f,0) != '\0') ||
                    (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0xbf,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar18[0x1f] < '\0') {
                auVar106 = vandps_avx(auVar19,auVar105);
              }
              uVar79 = vmovmskps_avx(auVar106);
              uVar83 = 0;
              if (uVar79 != 0) {
                for (; (uVar79 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar82 = (ulong)uVar83;
              local_6a0 = auVar105;
              *(undefined4 *)(local_6a0 + uVar82 * 4) = 0;
              aVar3 = (ray->dir).field_0.field_1;
              local_860 = aVar3.x;
              fStack_85c = aVar3.y;
              fStack_858 = aVar3.z;
              aStack_854 = aVar3.field_3;
              auVar188 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar226 = local_1c0[uVar82];
              uVar83 = *(uint *)(local_4e0 + uVar82 * 4);
              if (auVar188._0_4_ < 0.0) {
                fVar182 = sqrtf(auVar188._0_4_);
              }
              else {
                auVar188 = vsqrtss_avx(auVar188,auVar188);
                fVar182 = auVar188._0_4_;
              }
              auVar194 = vminps_avx(_local_980,_local_9a0);
              auVar188 = vmaxps_avx(_local_980,_local_9a0);
              auVar99 = vminps_avx(_local_990,_local_9b0);
              auVar164 = vminps_avx(auVar194,auVar99);
              auVar194 = vmaxps_avx(_local_990,_local_9b0);
              auVar99 = vmaxps_avx(auVar188,auVar194);
              auVar191._8_4_ = 0x7fffffff;
              auVar191._0_8_ = 0x7fffffff7fffffff;
              auVar191._12_4_ = 0x7fffffff;
              auVar188 = vandps_avx(auVar164,auVar191);
              auVar194 = vandps_avx(auVar99,auVar191);
              auVar188 = vmaxps_avx(auVar188,auVar194);
              auVar194 = vmovshdup_avx(auVar188);
              auVar194 = vmaxss_avx(auVar194,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar194);
              local_880 = auVar188._0_4_ * 1.9073486e-06;
              local_6c0._0_4_ = fVar182 * 1.9073486e-06;
              local_740._0_16_ = vshufps_avx(auVar99,auVar99,0xff);
              auVar188 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar226),0x10);
              auVar322 = ZEXT1664(auVar188);
              bVar89 = true;
              uVar82 = 0;
              do {
                auVar319 = auVar322._0_16_;
                auVar194 = vmovshdup_avx(auVar319);
                fVar241 = auVar194._0_4_;
                fVar203 = 1.0 - fVar241;
                fVar226 = fVar203 * fVar203;
                fVar182 = fVar203 * fVar226;
                fVar239 = fVar241 * fVar241;
                fVar202 = fVar241 * fVar239;
                fVar240 = fVar241 * fVar203;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar202 * 0.16666667)),
                                       ZEXT416((uint)(fVar202 * 0.16666667)),0);
                auVar99 = ZEXT416((uint)((fVar202 * 4.0 + fVar182 +
                                         fVar241 * fVar240 * 12.0 + fVar203 * fVar240 * 6.0) *
                                        0.16666667));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar164 = ZEXT416((uint)((fVar182 * 4.0 + fVar202 +
                                          fVar203 * fVar240 * 12.0 + fVar241 * fVar240 * 6.0) *
                                         0.16666667));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar101 = vshufps_avx(auVar319,auVar319,0);
                auVar165._0_4_ = auVar101._0_4_ * local_860 + 0.0;
                auVar165._4_4_ = auVar101._4_4_ * fStack_85c + 0.0;
                auVar165._8_4_ = auVar101._8_4_ * fStack_858 + 0.0;
                auVar165._12_4_ = auVar101._12_4_ * aStack_854.w + 0.0;
                auVar101 = vshufps_avx(ZEXT416((uint)(fVar182 * 0.16666667)),
                                       ZEXT416((uint)(fVar182 * 0.16666667)),0);
                auVar98._0_4_ =
                     auVar101._0_4_ * (float)local_980._0_4_ +
                     auVar164._0_4_ * (float)local_9a0._0_4_ +
                     auVar188._0_4_ * (float)local_9b0._0_4_ +
                     auVar99._0_4_ * (float)local_990._0_4_;
                auVar98._4_4_ =
                     auVar101._4_4_ * (float)local_980._4_4_ +
                     auVar164._4_4_ * (float)local_9a0._4_4_ +
                     auVar188._4_4_ * (float)local_9b0._4_4_ +
                     auVar99._4_4_ * (float)local_990._4_4_;
                auVar98._8_4_ =
                     auVar101._8_4_ * fStack_978 +
                     auVar164._8_4_ * fStack_998 +
                     auVar188._8_4_ * fStack_9a8 + auVar99._8_4_ * fStack_988;
                auVar98._12_4_ =
                     auVar101._12_4_ * fStack_974 +
                     auVar164._12_4_ * fStack_994 +
                     auVar188._12_4_ * fStack_9a4 + auVar99._12_4_ * fStack_984;
                local_840._0_16_ = auVar98;
                auVar188 = vsubps_avx(auVar165,auVar98);
                _local_a60 = auVar188;
                auVar188 = vdpps_avx(auVar188,auVar188,0x7f);
                fVar182 = auVar188._0_4_;
                local_b20 = auVar322._0_4_;
                if (fVar182 < 0.0) {
                  local_9e0._0_16_ = auVar194;
                  local_a00._0_4_ = fVar239;
                  local_a20._0_4_ = fVar226;
                  local_a40._0_4_ = fVar240;
                  auVar347._0_4_ = sqrtf(fVar182);
                  auVar347._4_60_ = extraout_var_00;
                  auVar99 = auVar347._0_16_;
                  auVar194 = local_9e0._0_16_;
                  fVar239 = (float)local_a00._0_4_;
                  fVar240 = (float)local_a40._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar188,auVar188);
                  local_a20._0_4_ = fVar226;
                }
                auVar359 = ZEXT1664(auVar194);
                auVar343 = ZEXT1664(auVar99);
                fVar226 = auVar194._0_4_;
                auVar164 = vshufps_avx(ZEXT416((uint)(fVar239 * 0.5)),ZEXT416((uint)(fVar239 * 0.5))
                                       ,0);
                auVar101 = ZEXT416((uint)(((float)local_a20._0_4_ + fVar240 * 4.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar91 = ZEXT416((uint)((fVar226 * -fVar226 - fVar240 * 4.0) * 0.5));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar100 = ZEXT416((uint)(fVar203 * -fVar203 * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar305._0_4_ =
                     (float)local_980._0_4_ * auVar100._0_4_ +
                     (float)local_9a0._0_4_ * auVar91._0_4_ +
                     (float)local_9b0._0_4_ * auVar164._0_4_ +
                     (float)local_990._0_4_ * auVar101._0_4_;
                auVar305._4_4_ =
                     (float)local_980._4_4_ * auVar100._4_4_ +
                     (float)local_9a0._4_4_ * auVar91._4_4_ +
                     (float)local_9b0._4_4_ * auVar164._4_4_ +
                     (float)local_990._4_4_ * auVar101._4_4_;
                auVar305._8_4_ =
                     fStack_978 * auVar100._8_4_ +
                     fStack_998 * auVar91._8_4_ +
                     fStack_9a8 * auVar164._8_4_ + fStack_988 * auVar101._8_4_;
                auVar305._12_4_ =
                     fStack_974 * auVar100._12_4_ +
                     fStack_994 * auVar91._12_4_ +
                     fStack_9a4 * auVar164._12_4_ + fStack_984 * auVar101._12_4_;
                auVar164 = vshufps_avx(auVar319,auVar319,0x55);
                auVar101 = ZEXT416((uint)(fVar203 - (fVar226 + fVar226)));
                auVar91 = vshufps_avx(auVar101,auVar101,0);
                auVar101 = ZEXT416((uint)(fVar226 - (fVar203 + fVar203)));
                auVar100 = vshufps_avx(auVar101,auVar101,0);
                auVar133 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                auVar101 = vdpps_avx(auVar305,auVar305,0x7f);
                auVar131._0_4_ =
                     (float)local_980._0_4_ * auVar133._0_4_ +
                     (float)local_9a0._0_4_ * auVar100._0_4_ +
                     (float)local_9b0._0_4_ * auVar164._0_4_ +
                     (float)local_990._0_4_ * auVar91._0_4_;
                auVar131._4_4_ =
                     (float)local_980._4_4_ * auVar133._4_4_ +
                     (float)local_9a0._4_4_ * auVar100._4_4_ +
                     (float)local_9b0._4_4_ * auVar164._4_4_ +
                     (float)local_990._4_4_ * auVar91._4_4_;
                auVar131._8_4_ =
                     fStack_978 * auVar133._8_4_ +
                     fStack_998 * auVar100._8_4_ +
                     fStack_9a8 * auVar164._8_4_ + fStack_988 * auVar91._8_4_;
                auVar131._12_4_ =
                     fStack_974 * auVar133._12_4_ +
                     fStack_994 * auVar100._12_4_ +
                     fStack_9a4 * auVar164._12_4_ + fStack_984 * auVar91._12_4_;
                auVar164 = vblendps_avx(auVar101,_DAT_01f7aa10,0xe);
                auVar91 = vrsqrtss_avx(auVar164,auVar164);
                fVar239 = auVar91._0_4_;
                fVar226 = auVar101._0_4_;
                auVar91 = vdpps_avx(auVar305,auVar131,0x7f);
                auVar100 = vshufps_avx(auVar101,auVar101,0);
                auVar132._0_4_ = auVar131._0_4_ * auVar100._0_4_;
                auVar132._4_4_ = auVar131._4_4_ * auVar100._4_4_;
                auVar132._8_4_ = auVar131._8_4_ * auVar100._8_4_;
                auVar132._12_4_ = auVar131._12_4_ * auVar100._12_4_;
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar212._0_4_ = auVar305._0_4_ * auVar91._0_4_;
                auVar212._4_4_ = auVar305._4_4_ * auVar91._4_4_;
                auVar212._8_4_ = auVar305._8_4_ * auVar91._8_4_;
                auVar212._12_4_ = auVar305._12_4_ * auVar91._12_4_;
                auVar133 = vsubps_avx(auVar132,auVar212);
                auVar91 = vrcpss_avx(auVar164,auVar164);
                auVar164 = vmaxss_avx(ZEXT416((uint)local_880),
                                      ZEXT416((uint)(local_b20 * (float)local_6c0._0_4_)));
                auVar91 = ZEXT416((uint)(auVar91._0_4_ * (2.0 - fVar226 * auVar91._0_4_)));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                uVar68 = CONCAT44(auVar305._4_4_,auVar305._0_4_);
                local_a20._0_8_ = uVar68 ^ 0x8000000080000000;
                local_a20._8_4_ = -auVar305._8_4_;
                local_a20._12_4_ = -auVar305._12_4_;
                auVar100 = ZEXT416((uint)(fVar239 * 1.5 +
                                         fVar226 * -0.5 * fVar239 * fVar239 * fVar239));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar192._0_4_ = auVar100._0_4_ * auVar133._0_4_ * auVar91._0_4_;
                auVar192._4_4_ = auVar100._4_4_ * auVar133._4_4_ * auVar91._4_4_;
                auVar192._8_4_ = auVar100._8_4_ * auVar133._8_4_ * auVar91._8_4_;
                auVar192._12_4_ = auVar100._12_4_ * auVar133._12_4_ * auVar91._12_4_;
                auVar254._0_4_ = auVar305._0_4_ * auVar100._0_4_;
                auVar254._4_4_ = auVar305._4_4_ * auVar100._4_4_;
                auVar254._8_4_ = auVar305._8_4_ * auVar100._8_4_;
                auVar254._12_4_ = auVar305._12_4_ * auVar100._12_4_;
                local_9e0._0_4_ = auVar164._0_4_;
                if (fVar226 < 0.0) {
                  local_a00._0_4_ = auVar99._0_4_;
                  local_a40._0_16_ = auVar254;
                  local_8a0._0_16_ = auVar192;
                  auVar359 = ZEXT1664(auVar194);
                  fVar239 = sqrtf(fVar226);
                  auVar343 = ZEXT464((uint)local_a00._0_4_);
                  auVar192 = local_8a0._0_16_;
                  auVar254 = local_a40._0_16_;
                  fVar226 = (float)local_9e0._0_4_;
                }
                else {
                  auVar194 = vsqrtss_avx(auVar101,auVar101);
                  fVar239 = auVar194._0_4_;
                  fVar226 = auVar164._0_4_;
                }
                auVar194 = vdpps_avx(_local_a60,auVar254,0x7f);
                local_a00._0_4_ =
                     (local_880 / fVar239) * (auVar343._0_4_ + 1.0) +
                     auVar343._0_4_ * local_880 + fVar226;
                auVar99 = vdpps_avx(local_a20._0_16_,auVar254,0x7f);
                auVar164 = vdpps_avx(_local_a60,auVar192,0x7f);
                auVar73._4_4_ = fStack_85c;
                auVar73._0_4_ = local_860;
                auVar73._8_4_ = fStack_858;
                auVar73._12_4_ = aStack_854.a;
                auVar101 = vdpps_avx(auVar73,auVar254,0x7f);
                auVar91 = vdpps_avx(_local_a60,local_a20._0_16_,0x7f);
                fVar239 = auVar99._0_4_ + auVar164._0_4_;
                fVar202 = auVar194._0_4_;
                auVar102._0_4_ = fVar202 * fVar202;
                auVar102._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                auVar102._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                auVar102._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                auVar164 = vsubps_avx(auVar188,auVar102);
                local_a20._0_16_ = ZEXT416((uint)fVar239);
                auVar99 = vdpps_avx(_local_a60,auVar73,0x7f);
                fVar240 = auVar91._0_4_ - fVar202 * fVar239;
                fVar202 = auVar99._0_4_ - fVar202 * auVar101._0_4_;
                auVar99 = vrsqrtss_avx(auVar164,auVar164);
                fVar203 = auVar164._0_4_;
                fVar239 = auVar99._0_4_;
                fVar239 = fVar239 * 1.5 + fVar203 * -0.5 * fVar239 * fVar239 * fVar239;
                if (fVar203 < 0.0) {
                  local_a40._0_16_ = auVar194;
                  local_8a0._0_16_ = auVar101;
                  local_6e0._0_4_ = fVar240;
                  local_700._0_4_ = fVar202;
                  local_720._0_4_ = fVar239;
                  auVar343 = ZEXT1664(auVar343._0_16_);
                  auVar359 = ZEXT1664(auVar359._0_16_);
                  fVar203 = sqrtf(fVar203);
                  fVar239 = (float)local_720._0_4_;
                  fVar240 = (float)local_6e0._0_4_;
                  fVar202 = (float)local_700._0_4_;
                  auVar101 = local_8a0._0_16_;
                  auVar194 = local_a40._0_16_;
                  fVar226 = (float)local_9e0._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar164,auVar164);
                  fVar203 = auVar99._0_4_;
                }
                auVar347 = ZEXT1664(auVar188);
                auVar91 = vpermilps_avx(local_840._0_16_,0xff);
                auVar100 = vshufps_avx(auVar305,auVar305,0xff);
                fVar241 = fVar240 * fVar239 - auVar100._0_4_;
                auVar213._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
                auVar213._8_4_ = auVar101._8_4_ ^ 0x80000000;
                auVar213._12_4_ = auVar101._12_4_ ^ 0x80000000;
                auVar230._0_4_ = -fVar241;
                auVar230._4_4_ = 0x80000000;
                auVar230._8_4_ = 0x80000000;
                auVar230._12_4_ = 0x80000000;
                fVar240 = local_a20._0_4_ * fVar202 * fVar239;
                auVar261 = ZEXT464((uint)fVar240);
                auVar99 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar202 * fVar239)),0x1c);
                auVar101 = vmovsldup_avx(ZEXT416((uint)(fVar240 - auVar101._0_4_ * fVar241)));
                auVar99 = vdivps_avx(auVar99,auVar101);
                auVar164 = vinsertps_avx(local_a20._0_16_,auVar213,0x10);
                auVar164 = vdivps_avx(auVar164,auVar101);
                auVar101 = vmovsldup_avx(auVar194);
                auVar133 = ZEXT416((uint)(fVar203 - auVar91._0_4_));
                auVar91 = vmovsldup_avx(auVar133);
                auVar166._0_4_ = auVar101._0_4_ * auVar99._0_4_ + auVar91._0_4_ * auVar164._0_4_;
                auVar166._4_4_ = auVar101._4_4_ * auVar99._4_4_ + auVar91._4_4_ * auVar164._4_4_;
                auVar166._8_4_ = auVar101._8_4_ * auVar99._8_4_ + auVar91._8_4_ * auVar164._8_4_;
                auVar166._12_4_ =
                     auVar101._12_4_ * auVar99._12_4_ + auVar91._12_4_ * auVar164._12_4_;
                auVar99 = vsubps_avx(auVar319,auVar166);
                auVar322 = ZEXT1664(auVar99);
                auVar167._8_4_ = 0x7fffffff;
                auVar167._0_8_ = 0x7fffffff7fffffff;
                auVar167._12_4_ = 0x7fffffff;
                auVar194 = vandps_avx(auVar194,auVar167);
                if (auVar194._0_4_ < (float)local_a00._0_4_) {
                  auVar193._8_4_ = 0x7fffffff;
                  auVar193._0_8_ = 0x7fffffff7fffffff;
                  auVar193._12_4_ = 0x7fffffff;
                  auVar194 = vandps_avx(auVar133,auVar193);
                  if (auVar194._0_4_ <
                      (float)local_740._0_4_ * 1.9073486e-06 + fVar226 + (float)local_a00._0_4_) {
                    fVar226 = auVar99._0_4_ + (float)local_810._0_4_;
                    bVar78 = 0;
                    bVar77 = 0;
                    if (fVar226 < (ray->org).field_0.m128[3]) goto LAB_00e18e1f;
                    fVar239 = ray->tfar;
                    auVar290 = ZEXT3264(local_a80);
                    auVar308 = ZEXT3264(_local_920);
                    if (fVar239 < fVar226) goto LAB_00e18e31;
                    auVar194 = vmovshdup_avx(auVar99);
                    bVar78 = 0;
                    fVar202 = auVar194._0_4_;
                    if ((fVar202 < 0.0) || (1.0 < fVar202)) goto LAB_00e18e31;
                    auVar194 = vrsqrtss_avx(auVar188,auVar188);
                    fVar203 = auVar194._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar86].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      bVar78 = 0;
                      goto LAB_00e18e31;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar78 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_00e18e31;
                    auVar194 = ZEXT416((uint)(fVar203 * 1.5 +
                                             fVar182 * -0.5 * fVar203 * fVar203 * fVar203));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar195._0_4_ = auVar194._0_4_ * (float)local_a60._0_4_;
                    auVar195._4_4_ = auVar194._4_4_ * (float)local_a60._4_4_;
                    auVar195._8_4_ = auVar194._8_4_ * fStack_a58;
                    auVar195._12_4_ = auVar194._12_4_ * fStack_a54;
                    auVar103._0_4_ = auVar305._0_4_ + auVar100._0_4_ * auVar195._0_4_;
                    auVar103._4_4_ = auVar305._4_4_ + auVar100._4_4_ * auVar195._4_4_;
                    auVar103._8_4_ = auVar305._8_4_ + auVar100._8_4_ * auVar195._8_4_;
                    auVar103._12_4_ = auVar305._12_4_ + auVar100._12_4_ * auVar195._12_4_;
                    auVar194 = vshufps_avx(auVar195,auVar195,0xc9);
                    auVar164 = vshufps_avx(auVar305,auVar305,0xc9);
                    auVar196._0_4_ = auVar164._0_4_ * auVar195._0_4_;
                    auVar196._4_4_ = auVar164._4_4_ * auVar195._4_4_;
                    auVar196._8_4_ = auVar164._8_4_ * auVar195._8_4_;
                    auVar196._12_4_ = auVar164._12_4_ * auVar195._12_4_;
                    auVar214._0_4_ = auVar305._0_4_ * auVar194._0_4_;
                    auVar214._4_4_ = auVar305._4_4_ * auVar194._4_4_;
                    auVar214._8_4_ = auVar305._8_4_ * auVar194._8_4_;
                    auVar214._12_4_ = auVar305._12_4_ * auVar194._12_4_;
                    auVar101 = vsubps_avx(auVar214,auVar196);
                    auVar194 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar164 = vshufps_avx(auVar103,auVar103,0xc9);
                    auVar215._0_4_ = auVar164._0_4_ * auVar194._0_4_;
                    auVar215._4_4_ = auVar164._4_4_ * auVar194._4_4_;
                    auVar215._8_4_ = auVar164._8_4_ * auVar194._8_4_;
                    auVar215._12_4_ = auVar164._12_4_ * auVar194._12_4_;
                    auVar194 = vshufps_avx(auVar101,auVar101,0xd2);
                    auVar104._0_4_ = auVar103._0_4_ * auVar194._0_4_;
                    auVar104._4_4_ = auVar103._4_4_ * auVar194._4_4_;
                    auVar104._8_4_ = auVar103._8_4_ * auVar194._8_4_;
                    auVar104._12_4_ = auVar103._12_4_ * auVar194._12_4_;
                    auVar164 = vsubps_avx(auVar215,auVar104);
                    auVar194 = vshufps_avx(auVar164,auVar164,0xe9);
                    local_8d0 = vmovlps_avx(auVar194);
                    local_8c8 = auVar164._0_4_;
                    local_8c0 = 0;
                    local_8b4 = context->user->instID[0];
                    local_8b0 = context->user->instPrimID[0];
                    ray->tfar = fVar226;
                    local_a84 = -1;
                    local_970.valid = &local_a84;
                    local_970.geometryUserPtr = pGVar7->userPtr;
                    local_970.context = context->user;
                    local_970.hit = (RTCHitN *)&local_8d0;
                    local_970.N = 1;
                    local_970.ray = (RTCRayN *)ray;
                    local_8c4 = fVar202;
                    local_8bc = uVar1;
                    local_8b8 = uVar86;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e19057:
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar322 = ZEXT1664(auVar322._0_16_);
                        auVar343 = ZEXT1664(auVar343._0_16_);
                        auVar347 = ZEXT1664(auVar347._0_16_);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        (*p_Var8)(&local_970);
                        if (*local_970.valid == 0) goto LAB_00e1909d;
                      }
                      bVar77 = 1;
                    }
                    else {
                      auVar261 = ZEXT464((uint)fVar240);
                      auVar322 = ZEXT1664(auVar99);
                      auVar343 = ZEXT1664(auVar343._0_16_);
                      auVar347 = ZEXT1664(auVar188);
                      auVar359 = ZEXT1664(auVar359._0_16_);
                      (*pGVar7->occlusionFilterN)(&local_970);
                      if (*local_970.valid != 0) goto LAB_00e19057;
LAB_00e1909d:
                      ray->tfar = fVar239;
                      bVar77 = 0;
                    }
                    goto LAB_00e18e1f;
                  }
                }
                bVar89 = uVar82 < 4;
                uVar82 = uVar82 + 1;
              } while (uVar82 != 5);
              bVar89 = false;
              bVar77 = 5;
LAB_00e18e1f:
              bVar78 = bVar77;
              auVar290 = ZEXT3264(local_a80);
              auVar308 = ZEXT3264(_local_920);
LAB_00e18e31:
              bVar88 = (bool)(bVar88 | bVar89 & bVar78);
              fVar226 = ray->tfar;
              auVar114._4_4_ = fVar226;
              auVar114._0_4_ = fVar226;
              auVar114._8_4_ = fVar226;
              auVar114._12_4_ = fVar226;
              auVar114._16_4_ = fVar226;
              auVar114._20_4_ = fVar226;
              auVar114._24_4_ = fVar226;
              auVar114._28_4_ = fVar226;
              auVar106 = vcmpps_avx(_local_940,auVar114,2);
              auVar105 = vandps_avx(auVar106,local_6a0);
              auVar106 = local_6a0 & auVar106;
              local_6a0 = auVar105;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          auVar105 = vandps_avx(local_580,local_660);
          auVar106 = vandps_avx(_local_7a0,_local_900);
          auVar216._0_4_ = auVar290._0_4_ + local_4c0._0_4_;
          auVar216._4_4_ = auVar290._4_4_ + local_4c0._4_4_;
          auVar216._8_4_ = auVar290._8_4_ + local_4c0._8_4_;
          auVar216._12_4_ = auVar290._12_4_ + local_4c0._12_4_;
          auVar216._16_4_ = auVar290._16_4_ + local_4c0._16_4_;
          auVar216._20_4_ = auVar290._20_4_ + local_4c0._20_4_;
          auVar216._24_4_ = auVar290._24_4_ + local_4c0._24_4_;
          auVar216._28_4_ = auVar290._28_4_ + local_4c0._28_4_;
          auVar19 = vcmpps_avx(auVar216,auVar114,2);
          auVar105 = vandps_avx(auVar19,auVar105);
          auVar217._0_4_ = local_500._0_4_ + auVar290._0_4_;
          auVar217._4_4_ = local_500._4_4_ + auVar290._4_4_;
          auVar217._8_4_ = local_500._8_4_ + auVar290._8_4_;
          auVar217._12_4_ = local_500._12_4_ + auVar290._12_4_;
          auVar217._16_4_ = local_500._16_4_ + auVar290._16_4_;
          auVar217._20_4_ = local_500._20_4_ + auVar290._20_4_;
          auVar217._24_4_ = local_500._24_4_ + auVar290._24_4_;
          auVar217._28_4_ = local_500._28_4_ + auVar290._28_4_;
          auVar19 = vcmpps_avx(auVar217,auVar114,2);
          auVar106 = vandps_avx(auVar19,auVar106);
          auVar106 = vorps_avx(auVar105,auVar106);
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar87 * 0x60) = auVar106;
            auVar105 = vblendvps_avx(_local_500,local_4c0,auVar105);
            *(undefined1 (*) [32])(auStack_160 + uVar87 * 0x60) = auVar105;
            uVar2 = vmovlps_avx(local_510);
            (&uStack_140)[uVar87 * 0xc] = uVar2;
            aiStack_138[uVar87 * 0x18] = local_b34 + 1;
            iVar85 = iVar85 + 1;
          }
          goto LAB_00e17a64;
        }
      }
      auVar343 = ZEXT3264(_local_920);
      auVar290 = ZEXT3264(local_a80);
    }
LAB_00e17a64:
    auVar5._0_4_ = ray->tfar;
    auVar5._4_4_ = ray->mask;
    auVar5._8_4_ = ray->id;
    auVar5._12_4_ = ray->flags;
    if (iVar85 == 0) break;
    fVar226 = ray->tfar;
    auVar136._4_4_ = fVar226;
    auVar136._0_4_ = fVar226;
    auVar136._8_4_ = fVar226;
    auVar136._12_4_ = fVar226;
    auVar136._16_4_ = fVar226;
    auVar136._20_4_ = fVar226;
    auVar136._24_4_ = fVar226;
    auVar136._28_4_ = fVar226;
    uVar83 = -iVar85;
    pauVar81 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar85 - 1) * 0x60);
    while( true ) {
      auVar105 = pauVar81[1];
      auVar172._0_4_ = auVar290._0_4_ + auVar105._0_4_;
      auVar172._4_4_ = auVar290._4_4_ + auVar105._4_4_;
      auVar172._8_4_ = auVar290._8_4_ + auVar105._8_4_;
      auVar172._12_4_ = auVar290._12_4_ + auVar105._12_4_;
      auVar172._16_4_ = auVar290._16_4_ + auVar105._16_4_;
      auVar172._20_4_ = auVar290._20_4_ + auVar105._20_4_;
      auVar172._24_4_ = auVar290._24_4_ + auVar105._24_4_;
      auVar172._28_4_ = auVar290._28_4_ + auVar105._28_4_;
      auVar19 = vcmpps_avx(auVar172,auVar136,2);
      auVar238 = ZEXT3264(auVar19);
      auVar106 = vandps_avx(auVar19,*pauVar81);
      local_4c0 = auVar106;
      auVar19 = *pauVar81 & auVar19;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') break;
      pauVar81 = pauVar81 + -3;
      uVar83 = uVar83 + 1;
      if (uVar83 == 0) goto LAB_00e1924b;
    }
    auVar112._8_4_ = 0x7f800000;
    auVar112._0_8_ = 0x7f8000007f800000;
    auVar112._12_4_ = 0x7f800000;
    auVar112._16_4_ = 0x7f800000;
    auVar112._20_4_ = 0x7f800000;
    auVar112._24_4_ = 0x7f800000;
    auVar112._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar112,auVar105,auVar106);
    auVar19 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar19 = vminps_avx(auVar105,auVar19);
    auVar18 = vshufpd_avx(auVar19,auVar19,5);
    auVar19 = vminps_avx(auVar19,auVar18);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar19 = vminps_avx(auVar19,auVar18);
    auVar105 = vcmpps_avx(auVar105,auVar19,0);
    auVar19 = auVar106 & auVar105;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar106 = vandps_avx(auVar105,auVar106);
    }
    auVar93._8_8_ = 0;
    auVar93._0_8_ = *(ulong *)pauVar81[2];
    local_b34 = *(uint *)(pauVar81[2] + 8);
    uVar84 = vmovmskps_avx(auVar106);
    uVar79 = 0;
    if (uVar84 != 0) {
      for (; (uVar84 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
      }
    }
    *(undefined4 *)(local_4c0 + (ulong)uVar79 * 4) = 0;
    *pauVar81 = local_4c0;
    uVar84 = ~uVar83;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar84 = -uVar83;
    }
    uVar87 = (ulong)uVar84;
    auVar188 = vshufps_avx(auVar93,auVar93,0);
    auVar194 = vshufps_avx(auVar93,auVar93,0x55);
    auVar194 = vsubps_avx(auVar194,auVar188);
    local_500._4_4_ = auVar188._4_4_ + auVar194._4_4_ * 0.14285715;
    local_500._0_4_ = auVar188._0_4_ + auVar194._0_4_ * 0.0;
    fStack_4f8 = auVar188._8_4_ + auVar194._8_4_ * 0.2857143;
    fStack_4f4 = auVar188._12_4_ + auVar194._12_4_ * 0.42857146;
    fStack_4f0 = auVar188._0_4_ + auVar194._0_4_ * 0.5714286;
    fStack_4ec = auVar188._4_4_ + auVar194._4_4_ * 0.71428573;
    fStack_4e8 = auVar188._8_4_ + auVar194._8_4_ * 0.8571429;
    fStack_4e4 = auVar188._12_4_ + auVar194._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (ulong)uVar79 * 4);
  } while( true );
LAB_00e1924b:
  if (bVar88 != false) {
    return bVar88;
  }
  auVar188 = vshufps_avx(auVar5,auVar5,0);
  auVar188 = vcmpps_avx(local_520,auVar188,2);
  uVar86 = vmovmskps_avx(auVar188);
  uVar86 = (uint)local_7e8 & uVar86;
  if (uVar86 == 0) {
    return false;
  }
  goto LAB_00e169a2;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }